

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx::
     BVHNIntersectorKHybrid<4,_4,_16777232,_false,_embree::avx::SubdivPatch1MBIntersectorK<4>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  long lVar1;
  float fVar2;
  float fVar3;
  BVH *bvh;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  long lVar6;
  undefined1 auVar7 [16];
  anon_union_16_2_9473010e_for_vint_impl<4>_1 aVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [12];
  undefined1 auVar20 [12];
  undefined1 auVar21 [12];
  uint uVar22;
  int iVar23;
  AABBNodeMB4D *node1;
  ulong uVar24;
  long lVar25;
  undefined4 uVar26;
  size_t sVar27;
  long lVar28;
  ulong uVar29;
  long lVar30;
  Primitive_conflict3 *prim;
  NodeRef root;
  ulong uVar31;
  long lVar32;
  char *pcVar33;
  ulong uVar34;
  char *pcVar35;
  uint uVar36;
  long lVar37;
  char *pcVar38;
  long lVar39;
  char *pcVar40;
  NodeRef *pNVar41;
  ulong uVar42;
  long lVar43;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar44;
  bool bVar45;
  float fVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar66;
  float fVar67;
  float fVar68;
  undefined1 in_ZMM0 [64];
  float fVar69;
  float fVar70;
  float fVar91;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  float fVar92;
  float fVar113;
  float fVar114;
  vint4 ai_2;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  float fVar115;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  vint4 bi_1;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  vint4 bi_3;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  vint4 bi;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  float fVar159;
  float fVar169;
  float fVar170;
  vint4 bi_2;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  float fVar171;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  float fVar172;
  undefined1 auVar173 [16];
  float fVar186;
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  float fVar184;
  float fVar185;
  undefined1 auVar183 [64];
  float fVar187;
  float fVar188;
  float fVar198;
  float fVar201;
  float fVar203;
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  float fVar199;
  float fVar202;
  float fVar204;
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  float fVar200;
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  float fVar205;
  float fVar210;
  float fVar211;
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  float fVar212;
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  float fVar213;
  float fVar218;
  float fVar220;
  float fVar221;
  undefined1 auVar214 [16];
  float fVar219;
  float fVar222;
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  float fVar223;
  float fVar226;
  float fVar227;
  float fVar228;
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  float fVar229;
  float fVar230;
  float fVar234;
  float fVar235;
  vint4 ai;
  undefined1 auVar231 [16];
  float fVar236;
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  float fVar237;
  float fVar240;
  float fVar241;
  vint4 ai_1;
  undefined1 auVar238 [16];
  float fVar242;
  undefined1 auVar239 [16];
  float fVar245;
  vint4 ai_3;
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  float fVar246;
  float fVar247;
  float fVar248;
  float fVar249;
  undefined1 auVar250 [16];
  float fVar254;
  float fVar255;
  float fVar257;
  float fVar258;
  float fVar259;
  float fVar260;
  float fVar261;
  undefined1 auVar251 [16];
  float fVar253;
  float fVar256;
  undefined1 auVar252 [64];
  undefined1 local_1c48 [8];
  float fStack_1c40;
  float fStack_1c3c;
  undefined1 local_1c28 [8];
  float fStack_1c20;
  float fStack_1c1c;
  float local_1bf8;
  float fStack_1bf4;
  float fStack_1bf0;
  float local_1be8;
  float fStack_1be4;
  float fStack_1be0;
  undefined1 local_1bc8 [16];
  Intersectors *local_1bb8;
  RayK<4> *local_1bb0;
  char *local_1ba8;
  char *local_1ba0;
  char *local_1b98;
  char *local_1b90;
  char *local_1b88;
  char *local_1b80;
  char *local_1b78;
  uint local_1b6c;
  undefined1 local_1b68 [16];
  undefined1 local_1b58 [16];
  undefined1 local_1b48 [16];
  undefined1 local_1b38 [16];
  undefined1 local_1b28 [16];
  float local_1b18;
  float fStack_1b14;
  float fStack_1b10;
  float fStack_1b0c;
  vbool<4> terminated;
  Precalculations pre;
  long local_1ad8;
  char *local_1ad0;
  char *local_1ac8;
  char *local_1ac0;
  RTCFilterFunctionNArguments args;
  undefined1 local_1a88 [8];
  float fStack_1a80;
  float fStack_1a7c;
  float local_1a38;
  float fStack_1a34;
  float fStack_1a30;
  float fStack_1a2c;
  float local_1a28;
  float fStack_1a24;
  float fStack_1a20;
  float fStack_1a1c;
  vint<4> vitime;
  undefined8 local_1a08;
  undefined8 uStack_1a00;
  undefined8 local_19f8;
  undefined8 uStack_19f0;
  undefined8 local_19e8;
  undefined8 uStack_19e0;
  float local_19d8;
  float fStack_19d4;
  float fStack_19d0;
  float fStack_19cc;
  float local_19c8;
  float fStack_19c4;
  float fStack_19c0;
  float fStack_19bc;
  undefined1 local_19b8 [16];
  undefined1 local_19a8 [16];
  uint local_1998;
  uint uStack_1994;
  uint uStack_1990;
  uint uStack_198c;
  uint uStack_1988;
  uint uStack_1984;
  uint uStack_1980;
  uint uStack_197c;
  TravRayK<4,_false> tray;
  uint local_1858;
  uint uStack_1854;
  uint uStack_1850;
  uint uStack_184c;
  undefined1 local_1838 [16];
  undefined1 local_1828 [16];
  undefined1 local_1818 [16];
  undefined1 local_1808 [16];
  undefined1 local_17f8 [16];
  undefined1 local_17e8 [8];
  float fStack_17e0;
  float fStack_17dc;
  undefined8 local_17d8;
  undefined8 uStack_17d0;
  undefined1 local_17c8 [16];
  undefined1 local_17b8 [16];
  undefined1 local_17a8 [16];
  undefined1 local_1798 [16];
  undefined1 local_1788 [16];
  undefined1 local_1778 [8];
  float fStack_1770;
  float fStack_176c;
  undefined8 local_1768;
  undefined8 uStack_1760;
  undefined8 uStack_1700;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  undefined1 auVar215 [16];
  
  auVar7 = mm_lookupmask_ps._0_16_;
  bvh = (BVH *)This->ptr;
  if ((bvh->root).ptr != 8) {
    auVar112 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar72 = vpcmpeqd_avx(auVar112,(undefined1  [16])valid_i->field_0);
    auVar71 = ZEXT816(0) << 0x40;
    auVar90 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar71,5);
    auVar129 = auVar72 & auVar90;
    if ((((auVar129 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar129 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar129 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar129[0xf] < '\0'
       ) {
      auVar90 = vandps_avx(auVar90,auVar72);
      auVar183 = ZEXT1664(auVar90);
      pre.super_Precalculations.grid = (GridSOA *)0x0;
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar206._8_4_ = 0x7fffffff;
      auVar206._0_8_ = 0x7fffffff7fffffff;
      auVar206._12_4_ = 0x7fffffff;
      auVar72 = vandps_avx(auVar206,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar64._8_4_ = 0x219392ef;
      auVar64._0_8_ = 0x219392ef219392ef;
      auVar64._12_4_ = 0x219392ef;
      auVar72 = vcmpps_avx(auVar72,auVar64,1);
      auVar129 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.x.field_0,auVar64,auVar72)
      ;
      auVar72 = vandps_avx(auVar206,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar72 = vcmpps_avx(auVar72,auVar64,1);
      auVar130 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.y.field_0,auVar64,auVar72)
      ;
      auVar72 = vandps_avx(auVar206,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      auVar72 = vcmpps_avx(auVar72,auVar64,1);
      auVar72 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar64,auVar72);
      auVar65 = vrcpps_avx(auVar129);
      fVar9 = auVar65._0_4_;
      auVar56._0_4_ = auVar129._0_4_ * fVar9;
      fVar10 = auVar65._4_4_;
      auVar56._4_4_ = auVar129._4_4_ * fVar10;
      fVar69 = auVar65._8_4_;
      auVar56._8_4_ = auVar129._8_4_ * fVar69;
      fVar91 = auVar65._12_4_;
      auVar56._12_4_ = auVar129._12_4_ * fVar91;
      auVar143._8_4_ = 0x3f800000;
      auVar143._0_8_ = &DAT_3f8000003f800000;
      auVar143._12_4_ = 0x3f800000;
      auVar129 = vsubps_avx(auVar143,auVar56);
      tray.rdir.field_0._0_4_ = fVar9 + fVar9 * auVar129._0_4_;
      tray.rdir.field_0._4_4_ = fVar10 + fVar10 * auVar129._4_4_;
      tray.rdir.field_0._8_4_ = fVar69 + fVar69 * auVar129._8_4_;
      tray.rdir.field_0._12_4_ = fVar91 + fVar91 * auVar129._12_4_;
      auVar129 = vrcpps_avx(auVar130);
      fVar9 = auVar129._0_4_;
      auVar65._0_4_ = auVar130._0_4_ * fVar9;
      fVar10 = auVar129._4_4_;
      auVar65._4_4_ = auVar130._4_4_ * fVar10;
      fVar69 = auVar129._8_4_;
      auVar65._8_4_ = auVar130._8_4_ * fVar69;
      fVar91 = auVar129._12_4_;
      auVar65._12_4_ = auVar130._12_4_ * fVar91;
      auVar129 = vsubps_avx(auVar143,auVar65);
      tray.rdir.field_0._16_4_ = fVar9 + fVar9 * auVar129._0_4_;
      tray.rdir.field_0._20_4_ = fVar10 + fVar10 * auVar129._4_4_;
      tray.rdir.field_0._24_4_ = fVar69 + fVar69 * auVar129._8_4_;
      tray.rdir.field_0._28_4_ = fVar91 + fVar91 * auVar129._12_4_;
      auVar129 = vrcpps_avx(auVar72);
      fVar9 = auVar129._0_4_;
      auVar158._0_4_ = auVar72._0_4_ * fVar9;
      fVar10 = auVar129._4_4_;
      auVar158._4_4_ = auVar72._4_4_ * fVar10;
      fVar69 = auVar129._8_4_;
      auVar158._8_4_ = auVar72._8_4_ * fVar69;
      fVar91 = auVar129._12_4_;
      auVar158._12_4_ = auVar72._12_4_ * fVar91;
      auVar72 = vsubps_avx(auVar143,auVar158);
      tray.rdir.field_0._32_4_ = fVar9 + fVar9 * auVar72._0_4_;
      tray.rdir.field_0._36_4_ = fVar10 + fVar10 * auVar72._4_4_;
      tray.rdir.field_0._40_4_ = fVar69 + fVar69 * auVar72._8_4_;
      tray.rdir.field_0._44_4_ = fVar91 + fVar91 * auVar72._12_4_;
      auVar72 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar71,1);
      auVar160._8_4_ = 0x10;
      auVar160._0_8_ = 0x1000000010;
      auVar160._12_4_ = 0x10;
      tray.nearXYZ.field_0.field_0.x.field_0 = (vint_impl<4>)vandps_avx(auVar72,auVar160);
      auVar72 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar71,5);
      auVar129._8_4_ = 0x20;
      auVar129._0_8_ = 0x2000000020;
      auVar129._12_4_ = 0x20;
      auVar141._8_4_ = 0x30;
      auVar141._0_8_ = 0x3000000030;
      auVar141._12_4_ = 0x30;
      tray.nearXYZ.field_0.field_0.y.field_0 =
           (vint_impl<4>)vblendvps_avx(auVar141,auVar129,auVar72);
      auVar72 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar71,5);
      auVar130._8_4_ = 0x40;
      auVar130._0_8_ = 0x4000000040;
      auVar130._12_4_ = 0x40;
      auVar144._8_4_ = 0x50;
      auVar144._0_8_ = 0x5000000050;
      auVar144._12_4_ = 0x50;
      tray.nearXYZ.field_0.field_0.z.field_0 =
           (vint_impl<4>)vblendvps_avx(auVar144,auVar130,auVar72);
      auVar72 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar71);
      auVar129 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar71);
      auVar71._8_4_ = 0x7f800000;
      auVar71._0_8_ = 0x7f8000007f800000;
      auVar71._12_4_ = 0x7f800000;
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar71,auVar72,auVar90);
      auVar72._8_4_ = 0xff800000;
      auVar72._0_8_ = 0xff800000ff800000;
      auVar72._12_4_ = 0xff800000;
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar72,auVar129,auVar90);
      terminated.field_0.i[1] = auVar90._4_4_ ^ auVar112._4_4_;
      terminated.field_0.i[0] = auVar90._0_4_ ^ auVar112._0_4_;
      terminated.field_0.i[2] = auVar90._8_4_ ^ auVar112._8_4_;
      terminated.field_0.i[3] = auVar90._12_4_ ^ auVar112._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar36 = 3;
      }
      else {
        uVar36 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      local_1bb0 = ray + 0x80;
      pNVar41 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar44 = &stack_near[2].field_0;
      stack_near[0].field_0.i[0] = 0x7f800000;
      stack_near[0].field_0.i[1] = 0x7f800000;
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      stack_node[1].ptr = (bvh->root).ptr;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      local_1bb8 = This;
      do {
        paVar44 = paVar44 + -1;
        root.ptr = pNVar41[-1].ptr;
        pNVar41 = pNVar41 + -1;
        if (root.ptr == 0xfffffffffffffff8) {
LAB_00332763:
          iVar23 = 3;
        }
        else {
          aVar66 = *paVar44;
          auVar112 = vcmpps_avx((undefined1  [16])aVar66,(undefined1  [16])tray.tfar.field_0,1);
          uVar22 = vmovmskps_avx(auVar112);
          if (uVar22 == 0) {
LAB_00332774:
            iVar23 = 2;
          }
          else {
            uVar31 = (ulong)(uVar22 & 0xff);
            uVar22 = POPCOUNT(uVar22 & 0xff);
            iVar23 = 0;
            if (uVar22 <= uVar36) {
              do {
                sVar27 = 0;
                if (uVar31 != 0) {
                  for (; (uVar31 >> sVar27 & 1) == 0; sVar27 = sVar27 + 1) {
                  }
                }
                auVar183 = ZEXT1664(auVar183._0_16_);
                bVar45 = occluded1(local_1bb8,bvh,root,sVar27,&pre,ray,&tray,context);
                if (bVar45) {
                  terminated.field_0.i[sVar27] = -1;
                }
                uVar31 = uVar31 & uVar31 - 1;
              } while (uVar31 != 0);
              auVar112 = _DAT_01febe20 & ~(undefined1  [16])terminated.field_0;
              iVar23 = 3;
              if ((((auVar112 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar112 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar112 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar112[0xf] < '\0') {
                auVar112._8_4_ = 0xff800000;
                auVar112._0_8_ = 0xff800000ff800000;
                auVar112._12_4_ = 0xff800000;
                tray.tfar.field_0 =
                     (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar112,
                                   (undefined1  [16])terminated.field_0);
                iVar23 = 2;
              }
            }
            auVar252 = ZEXT1664((undefined1  [16])aVar66);
            if (uVar36 < uVar22) {
              do {
                uVar22 = (uint)root.ptr;
                if ((root.ptr & 8) != 0) {
                  if (root.ptr == 0xfffffffffffffff8) goto LAB_00332763;
                  auVar112 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,auVar252._0_16_,6);
                  if ((((auVar112 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar112 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar112 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      auVar112[0xf] < '\0') {
                    if ((uVar22 & 0xf) == 8) {
                      auVar94._0_4_ = (float)((pre.super_Precalculations.grid)->time_steps - 1);
                      auVar94._4_12_ = auVar183._4_12_;
                      auVar112 = vshufps_avx(auVar94,auVar94,0);
                      auVar57._0_4_ = auVar112._0_4_ * *(float *)(ray + 0x70);
                      auVar57._4_4_ = auVar112._4_4_ * *(float *)(ray + 0x74);
                      auVar57._8_4_ = auVar112._8_4_ * *(float *)(ray + 0x78);
                      auVar57._12_4_ = auVar112._12_4_ * *(float *)(ray + 0x7c);
                      auVar112 = vroundps_avx(auVar57,1);
                      auVar72 = vshufps_avx(ZEXT416((uint)(auVar94._0_4_ + -1.0)),
                                            ZEXT416((uint)(auVar94._0_4_ + -1.0)),0);
                      auVar112 = vminps_avx(auVar112,auVar72);
                      auVar112 = vmaxps_avx(auVar112,_DAT_01feba10);
                      aVar8 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)vcvtps2dq_avx(auVar112);
                      vitime.field_0 = aVar8;
                      uVar22 = vmovmskps_avx((undefined1  [16])terminated.field_0);
                      uVar22 = uVar22 ^ 0xf;
                      aVar13 = terminated.field_0;
                      if (uVar22 != 0) {
                        auVar112 = vsubps_avx(auVar57,auVar112);
                        auVar95._0_8_ = terminated.field_0._0_8_ ^ 0xffffffffffffffff;
                        auVar95._8_4_ = terminated.field_0._8_4_ ^ 0xffffffff;
                        auVar95._12_4_ = terminated.field_0._12_4_ ^ 0xffffffff;
                        auVar47._8_4_ = 0x3f800000;
                        auVar47._0_8_ = &DAT_3f8000003f800000;
                        auVar47._12_4_ = 0x3f800000;
                        auVar72 = vsubps_avx(auVar47,auVar112);
                        uVar31 = root.ptr >> 2 & 0xfffffffffffffffc;
                        auVar129 = auVar95;
                        do {
                          lVar6 = 0;
                          if ((uVar22 & 0xf) != 0) {
                            for (; ((uVar22 & 0xf) >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
                            }
                          }
                          local_1b18 = (float)(pre.super_Precalculations.grid)->dim_offset;
                          uVar34 = (ulong)(uint)local_1b18;
                          uVar42 = (ulong)(pre.super_Precalculations.grid)->width;
                          uVar24 = (ulong)(pre.super_Precalculations.grid)->gridOffset;
                          lVar39 = (ulong)(pre.super_Precalculations.grid)->gridBytes *
                                   (long)vitime.field_0.i[(int)lVar6];
                          uVar29 = (ulong)((pre.super_Precalculations.grid)->gridBytes & 0xfffffffc)
                          ;
                          lVar37 = uVar29 + uVar24 + lVar39;
                          lVar32 = uVar34 * 0xc + lVar37;
                          pcVar38 = (pre.super_Precalculations.grid)->data +
                                    lVar32 + uVar42 * 4 + uVar31 + -0x30;
                          fStack_1b14 = 0.0;
                          lVar28 = lVar39 + uVar34 * 8 + uVar24;
                          lVar30 = uVar29 + lVar28;
                          local_1b78 = (pre.super_Precalculations.grid)->data +
                                       lVar30 + uVar42 * 4 + uVar31 + -0x30;
                          lVar1 = lVar37 + uVar34 * 4;
                          local_1b80 = (pre.super_Precalculations.grid)->data +
                                       lVar1 + uVar42 * 4 + uVar31 + -0x30;
                          local_1b88 = (pre.super_Precalculations.grid)->data +
                                       lVar37 + uVar42 * 4 + uVar31 + -0x30;
                          lVar43 = uVar31 + 0x30;
                          local_1b90 = (pre.super_Precalculations.grid)->data +
                                       uVar24 + lVar39 + uVar42 * 4 + lVar43 + -0x30;
                          local_1b98 = (pre.super_Precalculations.grid)->data +
                                       lVar28 + uVar42 * 4 + lVar43 + -0x30;
                          lVar25 = lVar39 + (ulong)(uint)local_1b18 * 4 + uVar24;
                          local_1ba0 = (pre.super_Precalculations.grid)->data +
                                       lVar25 + uVar42 * 4 + lVar43 + -0x30;
                          pcVar35 = (pre.super_Precalculations.grid)->data + lVar32 + lVar43 + -0x30
                          ;
                          pcVar33 = (pre.super_Precalculations.grid)->data + lVar30 + lVar43 + -0x30
                          ;
                          local_1ba8 = (pre.super_Precalculations.grid)->data +
                                       lVar1 + lVar43 + -0x30;
                          local_1ac0 = (pre.super_Precalculations.grid)->data +
                                       lVar37 + lVar43 + -0x30;
                          local_1ac8 = (pre.super_Precalculations.grid)->data +
                                       lVar28 + lVar43 + -0x30;
                          local_1ad0 = (pre.super_Precalculations.grid)->data +
                                       lVar25 + lVar43 + -0x30;
                          auVar71 = vpshufd_avx(ZEXT416((uint)vitime.field_0.i[(int)lVar6]),0);
                          auVar71 = vpcmpeqd_avx(auVar71,(undefined1  [16])aVar8);
                          auVar71 = vpand_avx(auVar71,auVar129);
                          auVar130 = auVar71 ^ _DAT_01febe20;
                          pcVar40 = (pre.super_Precalculations.grid)->data + lVar39 + -0x30;
                          local_1b6c = (pre.super_Precalculations.grid)->height;
                          lVar6 = uVar42 * 4;
                          auVar252 = ZEXT1664(auVar71);
                          local_1ad8 = 0;
                          do {
                            lVar1 = uVar24 + 0x2c + uVar31;
                            lVar43 = 0;
                            do {
                              if ((ulong)(uVar42 != 2) * 4 + 4 == lVar43) break;
                              fVar9 = *(float *)(pcVar40 + lVar43 + lVar1);
                              fVar10 = *(float *)(local_1ad0 + lVar43 + -4);
                              fVar69 = *(float *)(local_1ac8 + lVar43 + -4);
                              fVar91 = *(float *)(pcVar40 + lVar43 + lVar1 + 4);
                              fVar46 = *(float *)(local_1ad0 + lVar43);
                              fVar67 = *(float *)(local_1ac8 + lVar43);
                              fVar68 = *(float *)(local_1b90 + lVar43 + -4);
                              fVar172 = *(float *)(local_1ba0 + lVar43 + -4);
                              fVar2 = *(float *)(local_1b98 + lVar43 + -4);
                              auVar144 = auVar252._0_16_;
                              fVar188 = *(float *)(local_1ac0 + lVar43 + -4);
                              fVar187 = *(float *)(local_1ba8 + lVar43 + -4);
                              fVar184 = *(float *)(pcVar33 + lVar43 + -4);
                              fVar3 = *(float *)(local_1ac0 + lVar43);
                              fVar200 = *(float *)(local_1ba8 + lVar43);
                              fVar198 = *(float *)(pcVar33 + lVar43);
                              fVar185 = *(float *)(local_1b88 + lVar43 + 0x2c);
                              local_1a28 = auVar112._0_4_;
                              fStack_1a24 = auVar112._4_4_;
                              fStack_1a20 = auVar112._8_4_;
                              fStack_1a1c = auVar112._12_4_;
                              local_1a38 = auVar72._0_4_;
                              fStack_1a34 = auVar72._4_4_;
                              fStack_1a30 = auVar72._8_4_;
                              fStack_1a2c = auVar72._12_4_;
                              local_1c48._4_4_ = fVar188 * fStack_1a24 + fStack_1a34 * fVar9;
                              local_1c48._0_4_ = fVar188 * local_1a28 + local_1a38 * fVar9;
                              fStack_1c40 = fVar188 * fStack_1a20 + fStack_1a30 * fVar9;
                              fStack_1c3c = fVar188 * fStack_1a1c + fStack_1a2c * fVar9;
                              fVar9 = *(float *)(local_1b80 + lVar43 + 0x2c);
                              auVar148._0_4_ = fVar187 * local_1a28 + local_1a38 * fVar10;
                              auVar148._4_4_ = fVar187 * fStack_1a24 + fStack_1a34 * fVar10;
                              auVar148._8_4_ = fVar187 * fStack_1a20 + fStack_1a30 * fVar10;
                              auVar148._12_4_ = fVar187 * fStack_1a1c + fStack_1a2c * fVar10;
                              fVar10 = *(float *)(local_1b78 + lVar43 + 0x2c);
                              auVar119._0_4_ = fVar184 * local_1a28 + local_1a38 * fVar69;
                              auVar119._4_4_ = fVar184 * fStack_1a24 + fStack_1a34 * fVar69;
                              auVar119._8_4_ = fVar184 * fStack_1a20 + fStack_1a30 * fVar69;
                              auVar119._12_4_ = fVar184 * fStack_1a1c + fStack_1a2c * fVar69;
                              local_1c28._4_4_ = fStack_1a34 * fVar91 + fVar3 * fStack_1a24;
                              local_1c28._0_4_ = local_1a38 * fVar91 + fVar3 * local_1a28;
                              fStack_1c20 = fStack_1a30 * fVar91 + fVar3 * fStack_1a20;
                              fStack_1c1c = fStack_1a2c * fVar91 + fVar3 * fStack_1a1c;
                              local_1b18 = fVar200 * local_1a28 + local_1a38 * fVar46;
                              fStack_1b14 = fVar200 * fStack_1a24 + fStack_1a34 * fVar46;
                              fStack_1b10 = fVar200 * fStack_1a20 + fStack_1a30 * fVar46;
                              fStack_1b0c = fVar200 * fStack_1a1c + fStack_1a2c * fVar46;
                              local_1a88._4_4_ = fVar198 * fStack_1a24 + fStack_1a34 * fVar67;
                              local_1a88._0_4_ = fVar198 * local_1a28 + local_1a38 * fVar67;
                              fStack_1a80 = fVar198 * fStack_1a20 + fStack_1a30 * fVar67;
                              fStack_1a7c = fVar198 * fStack_1a1c + fStack_1a2c * fVar67;
                              auVar214._0_4_ = local_1a38 * fVar68 + fVar185 * local_1a28;
                              auVar214._4_4_ = fStack_1a34 * fVar68 + fVar185 * fStack_1a24;
                              auVar214._8_4_ = fStack_1a30 * fVar68 + fVar185 * fStack_1a20;
                              auVar214._12_4_ = fStack_1a2c * fVar68 + fVar185 * fStack_1a1c;
                              auVar48._0_4_ = local_1a38 * fVar172 + fVar9 * local_1a28;
                              auVar48._4_4_ = fStack_1a34 * fVar172 + fVar9 * fStack_1a24;
                              auVar48._8_4_ = fStack_1a30 * fVar172 + fVar9 * fStack_1a20;
                              auVar48._12_4_ = fStack_1a2c * fVar172 + fVar9 * fStack_1a1c;
                              auVar73._0_4_ = local_1a38 * fVar2 + fVar10 * local_1a28;
                              auVar73._4_4_ = fStack_1a34 * fVar2 + fVar10 * fStack_1a24;
                              auVar73._8_4_ = fStack_1a30 * fVar2 + fVar10 * fStack_1a20;
                              auVar73._12_4_ = fStack_1a2c * fVar2 + fVar10 * fStack_1a1c;
                              auVar65 = *(undefined1 (*) [16])(ray + 0x10);
                              auVar56 = *(undefined1 (*) [16])(ray + 0x20);
                              auVar160 = vsubps_avx(auVar148,auVar65);
                              auVar141 = vsubps_avx(auVar119,auVar56);
                              auVar64 = vsubps_avx(auVar48,auVar65);
                              auVar143 = vsubps_avx(auVar73,auVar56);
                              auVar206 = vsubps_avx(auVar64,auVar160);
                              local_1b68 = vsubps_avx(auVar143,auVar141);
                              fVar245 = auVar160._0_4_;
                              fVar172 = fVar245 + auVar64._0_4_;
                              fVar247 = auVar160._4_4_;
                              fVar184 = fVar247 + auVar64._4_4_;
                              fVar249 = auVar160._8_4_;
                              fVar185 = fVar249 + auVar64._8_4_;
                              fVar254 = auVar160._12_4_;
                              fVar186 = fVar254 + auVar64._12_4_;
                              fVar9 = auVar141._0_4_;
                              fVar187 = auVar143._0_4_ + fVar9;
                              fVar10 = auVar141._4_4_;
                              fVar198 = auVar143._4_4_ + fVar10;
                              fVar69 = auVar141._8_4_;
                              fVar201 = auVar143._8_4_ + fVar69;
                              fVar91 = auVar141._12_4_;
                              fVar203 = auVar143._12_4_ + fVar91;
                              fVar46 = local_1b68._0_4_;
                              auVar49._0_4_ = fVar172 * fVar46;
                              fVar2 = local_1b68._4_4_;
                              auVar49._4_4_ = fVar184 * fVar2;
                              fVar3 = local_1b68._8_4_;
                              auVar49._8_4_ = fVar185 * fVar3;
                              fVar11 = local_1b68._12_4_;
                              auVar49._12_4_ = fVar186 * fVar11;
                              fVar67 = auVar206._0_4_;
                              auVar207._0_4_ = fVar187 * fVar67;
                              fVar188 = auVar206._4_4_;
                              auVar207._4_4_ = fVar198 * fVar188;
                              fVar200 = auVar206._8_4_;
                              auVar207._8_4_ = fVar201 * fVar200;
                              fVar12 = auVar206._12_4_;
                              auVar207._12_4_ = fVar203 * fVar12;
                              auVar57 = vsubps_avx(auVar207,auVar49);
                              auVar158 = *(undefined1 (*) [16])ray;
                              auVar94 = vsubps_avx(_local_1c48,auVar158);
                              auVar47 = vsubps_avx(auVar214,auVar158);
                              auVar14 = vsubps_avx(auVar47,auVar94);
                              fVar68 = auVar14._0_4_;
                              auVar189._0_4_ = fVar187 * fVar68;
                              fVar187 = auVar14._4_4_;
                              auVar189._4_4_ = fVar198 * fVar187;
                              fVar198 = auVar14._8_4_;
                              auVar189._8_4_ = fVar201 * fVar198;
                              fVar201 = auVar14._12_4_;
                              auVar189._12_4_ = fVar203 * fVar201;
                              fVar237 = auVar94._0_4_;
                              fVar203 = fVar237 + auVar47._0_4_;
                              fVar240 = auVar94._4_4_;
                              fVar218 = fVar240 + auVar47._4_4_;
                              fVar241 = auVar94._8_4_;
                              fVar221 = fVar241 + auVar47._8_4_;
                              fVar242 = auVar94._12_4_;
                              fVar222 = fVar242 + auVar47._12_4_;
                              auVar244._0_4_ = fVar203 * fVar46;
                              auVar244._4_4_ = fVar218 * fVar2;
                              auVar244._8_4_ = fVar221 * fVar3;
                              auVar244._12_4_ = fVar222 * fVar11;
                              auVar14 = vsubps_avx(auVar244,auVar189);
                              auVar190._0_4_ = fVar203 * fVar67;
                              auVar190._4_4_ = fVar218 * fVar188;
                              auVar190._8_4_ = fVar221 * fVar200;
                              auVar190._12_4_ = fVar222 * fVar12;
                              auVar174._0_4_ = fVar68 * fVar172;
                              auVar174._4_4_ = fVar187 * fVar184;
                              auVar174._8_4_ = fVar198 * fVar185;
                              auVar174._12_4_ = fVar201 * fVar186;
                              auVar49 = vsubps_avx(auVar174,auVar190);
                              fVar203 = *(float *)(ray + 0x60);
                              fVar218 = *(float *)(ray + 100);
                              fVar221 = *(float *)(ray + 0x68);
                              auVar20 = *(undefined1 (*) [12])(ray + 0x60);
                              fVar222 = *(float *)(ray + 0x6c);
                              auVar19 = *(undefined1 (*) [12])(ray + 0x50);
                              fVar248 = *(float *)(ray + 0x5c);
                              fVar255 = *(float *)(ray + 0x40);
                              fVar258 = *(float *)(ray + 0x44);
                              fVar261 = *(float *)(ray + 0x48);
                              auVar21 = *(undefined1 (*) [12])(ray + 0x40);
                              fVar70 = *(float *)(ray + 0x4c);
                              fVar213 = auVar57._0_4_ * fVar255 +
                                        auVar49._0_4_ * fVar203 +
                                        auVar14._0_4_ * *(float *)(ray + 0x50);
                              fVar219 = auVar57._4_4_ * fVar258 +
                                        auVar49._4_4_ * fVar218 +
                                        auVar14._4_4_ * *(float *)(ray + 0x54);
                              auVar215._0_8_ = CONCAT44(fVar219,fVar213);
                              auVar215._8_4_ =
                                   auVar57._8_4_ * fVar261 +
                                   auVar49._8_4_ * fVar221 + auVar14._8_4_ * *(float *)(ray + 0x58);
                              auVar215._12_4_ =
                                   auVar57._12_4_ * fVar70 +
                                   auVar49._12_4_ * fVar222 + auVar14._12_4_ * fVar248;
                              auVar14._4_4_ = fStack_1b14;
                              auVar14._0_4_ = local_1b18;
                              auVar14._8_4_ = fStack_1b10;
                              auVar14._12_4_ = fStack_1b0c;
                              auVar65 = vsubps_avx(auVar14,auVar65);
                              auVar56 = vsubps_avx(_local_1a88,auVar56);
                              auVar57 = vsubps_avx(auVar160,auVar65);
                              auVar14 = vsubps_avx(auVar141,auVar56);
                              fVar159 = fVar245 + auVar65._0_4_;
                              fVar169 = fVar247 + auVar65._4_4_;
                              fVar170 = fVar249 + auVar65._8_4_;
                              fVar171 = fVar254 + auVar65._12_4_;
                              fVar184 = fVar9 + auVar56._0_4_;
                              fVar185 = fVar10 + auVar56._4_4_;
                              fVar186 = fVar69 + auVar56._8_4_;
                              fVar228 = fVar91 + auVar56._12_4_;
                              fVar220 = auVar14._0_4_;
                              auVar250._0_4_ = fVar220 * fVar159;
                              fVar199 = auVar14._4_4_;
                              auVar250._4_4_ = fVar199 * fVar169;
                              fVar202 = auVar14._8_4_;
                              auVar250._8_4_ = fVar202 * fVar170;
                              fVar204 = auVar14._12_4_;
                              auVar250._12_4_ = fVar204 * fVar171;
                              fVar230 = auVar57._0_4_;
                              auVar175._0_4_ = fVar230 * fVar184;
                              fVar234 = auVar57._4_4_;
                              auVar175._4_4_ = fVar234 * fVar185;
                              fVar235 = auVar57._8_4_;
                              auVar175._8_4_ = fVar235 * fVar186;
                              fVar236 = auVar57._12_4_;
                              auVar175._12_4_ = fVar236 * fVar228;
                              auVar57 = vsubps_avx(auVar175,auVar250);
                              auVar158 = vsubps_avx(_local_1c28,auVar158);
                              auVar14 = vsubps_avx(auVar94,auVar158);
                              fVar172 = auVar14._0_4_;
                              auVar224._0_4_ = fVar184 * fVar172;
                              fVar184 = auVar14._4_4_;
                              auVar224._4_4_ = fVar185 * fVar184;
                              fVar185 = auVar14._8_4_;
                              auVar224._8_4_ = fVar186 * fVar185;
                              fVar186 = auVar14._12_4_;
                              auVar224._12_4_ = fVar228 * fVar186;
                              fVar228 = fVar237 + auVar158._0_4_;
                              fVar253 = fVar240 + auVar158._4_4_;
                              fVar256 = fVar241 + auVar158._8_4_;
                              fVar259 = fVar242 + auVar158._12_4_;
                              auVar191._0_4_ = fVar228 * fVar220;
                              auVar191._4_4_ = fVar253 * fVar199;
                              auVar191._8_4_ = fVar256 * fVar202;
                              auVar191._12_4_ = fVar259 * fVar204;
                              auVar14 = vsubps_avx(auVar191,auVar224);
                              auVar225._0_4_ = fVar228 * fVar230;
                              auVar225._4_4_ = fVar253 * fVar234;
                              auVar225._8_4_ = fVar256 * fVar235;
                              auVar225._12_4_ = fVar259 * fVar236;
                              auVar162._0_4_ = fVar172 * fVar159;
                              auVar162._4_4_ = fVar184 * fVar169;
                              auVar162._8_4_ = fVar185 * fVar170;
                              auVar162._12_4_ = fVar186 * fVar171;
                              auVar49 = vsubps_avx(auVar162,auVar225);
                              local_1c48._0_4_ = auVar19._0_4_;
                              local_1c48._4_4_ = auVar19._4_4_;
                              fStack_1c40 = auVar19._8_4_;
                              auVar192._8_4_ = 0x7fffffff;
                              auVar192._0_8_ = 0x7fffffff7fffffff;
                              auVar192._12_4_ = 0x7fffffff;
                              auVar163._0_4_ =
                                   fVar255 * auVar57._0_4_ +
                                   (float)local_1c48._0_4_ * auVar14._0_4_ + auVar49._0_4_ * fVar203
                              ;
                              auVar163._4_4_ =
                                   fVar258 * auVar57._4_4_ +
                                   (float)local_1c48._4_4_ * auVar14._4_4_ + auVar49._4_4_ * fVar218
                              ;
                              auVar163._8_4_ =
                                   fVar261 * auVar57._8_4_ +
                                   fStack_1c40 * auVar14._8_4_ + auVar49._8_4_ * fVar221;
                              auVar163._12_4_ =
                                   fVar70 * auVar57._12_4_ +
                                   fVar248 * auVar14._12_4_ + auVar49._12_4_ * fVar222;
                              auVar57 = vsubps_avx(auVar158,auVar47);
                              fVar159 = auVar158._0_4_ + auVar47._0_4_;
                              fVar169 = auVar158._4_4_ + auVar47._4_4_;
                              fVar170 = auVar158._8_4_ + auVar47._8_4_;
                              fVar171 = auVar158._12_4_ + auVar47._12_4_;
                              auVar158 = vsubps_avx(auVar65,auVar64);
                              fVar228 = auVar65._0_4_ + auVar64._0_4_;
                              fVar253 = auVar65._4_4_ + auVar64._4_4_;
                              fVar256 = auVar65._8_4_ + auVar64._8_4_;
                              fVar259 = auVar65._12_4_ + auVar64._12_4_;
                              auVar65 = vsubps_avx(auVar56,auVar143);
                              fVar92 = auVar56._0_4_ + auVar143._0_4_;
                              fVar113 = auVar56._4_4_ + auVar143._4_4_;
                              fVar114 = auVar56._8_4_ + auVar143._8_4_;
                              fVar115 = auVar56._12_4_ + auVar143._12_4_;
                              fVar205 = auVar65._0_4_;
                              auVar149._0_4_ = fVar205 * fVar228;
                              fVar210 = auVar65._4_4_;
                              auVar149._4_4_ = fVar210 * fVar253;
                              fVar211 = auVar65._8_4_;
                              auVar149._8_4_ = fVar211 * fVar256;
                              fVar212 = auVar65._12_4_;
                              auVar149._12_4_ = fVar212 * fVar259;
                              fVar223 = auVar158._0_4_;
                              auVar176._0_4_ = fVar223 * fVar92;
                              fVar226 = auVar158._4_4_;
                              auVar176._4_4_ = fVar226 * fVar113;
                              fVar227 = auVar158._8_4_;
                              auVar176._8_4_ = fVar227 * fVar114;
                              fVar229 = auVar158._12_4_;
                              auVar176._12_4_ = fVar229 * fVar115;
                              auVar65 = vsubps_avx(auVar176,auVar149);
                              fVar246 = auVar57._0_4_;
                              auVar96._0_4_ = fVar246 * fVar92;
                              fVar92 = auVar57._4_4_;
                              auVar96._4_4_ = fVar92 * fVar113;
                              fVar113 = auVar57._8_4_;
                              auVar96._8_4_ = fVar113 * fVar114;
                              fVar114 = auVar57._12_4_;
                              auVar96._12_4_ = fVar114 * fVar115;
                              auVar177._0_4_ = fVar205 * fVar159;
                              auVar177._4_4_ = fVar210 * fVar169;
                              auVar177._8_4_ = fVar211 * fVar170;
                              auVar177._12_4_ = fVar212 * fVar171;
                              auVar183 = ZEXT1664(auVar177);
                              auVar56 = vsubps_avx(auVar177,auVar96);
                              auVar50._0_4_ = fVar223 * fVar159;
                              auVar50._4_4_ = fVar226 * fVar169;
                              auVar50._8_4_ = fVar227 * fVar170;
                              auVar50._12_4_ = fVar229 * fVar171;
                              auVar74._0_4_ = fVar246 * fVar228;
                              auVar74._4_4_ = fVar92 * fVar253;
                              auVar74._8_4_ = fVar113 * fVar256;
                              auVar74._12_4_ = fVar114 * fVar259;
                              auVar158 = vsubps_avx(auVar74,auVar50);
                              auVar51._0_4_ =
                                   fVar255 * auVar65._0_4_ +
                                   fVar203 * auVar158._0_4_ +
                                   (float)local_1c48._0_4_ * auVar56._0_4_;
                              auVar51._4_4_ =
                                   fVar258 * auVar65._4_4_ +
                                   fVar218 * auVar158._4_4_ +
                                   (float)local_1c48._4_4_ * auVar56._4_4_;
                              auVar51._8_4_ =
                                   fVar261 * auVar65._8_4_ +
                                   fVar221 * auVar158._8_4_ + fStack_1c40 * auVar56._8_4_;
                              auVar51._12_4_ =
                                   fVar70 * auVar65._12_4_ +
                                   fVar222 * auVar158._12_4_ + fVar248 * auVar56._12_4_;
                              auVar134._0_4_ = auVar51._0_4_ + fVar213 + auVar163._0_4_;
                              auVar134._4_4_ = auVar51._4_4_ + fVar219 + auVar163._4_4_;
                              auVar134._8_4_ = auVar51._8_4_ + auVar215._8_4_ + auVar163._8_4_;
                              auVar134._12_4_ = auVar51._12_4_ + auVar215._12_4_ + auVar163._12_4_;
                              auVar65 = vandps_avx(auVar192,auVar134);
                              auVar75._0_4_ = auVar65._0_4_ * 1.1920929e-07;
                              auVar75._4_4_ = auVar65._4_4_ * 1.1920929e-07;
                              auVar75._8_4_ = auVar65._8_4_ * 1.1920929e-07;
                              auVar75._12_4_ = auVar65._12_4_ * 1.1920929e-07;
                              auVar65 = vminps_avx(auVar215,auVar163);
                              auVar65 = vminps_avx(auVar65,auVar51);
                              uVar29 = CONCAT44(auVar75._4_4_,auVar75._0_4_);
                              auVar150._0_8_ = uVar29 ^ 0x8000000080000000;
                              auVar150._8_4_ = -auVar75._8_4_;
                              auVar150._12_4_ = -auVar75._12_4_;
                              auVar65 = vcmpps_avx(auVar65,auVar150,5);
                              auVar56 = vmaxps_avx(auVar215,auVar163);
                              auVar56 = vmaxps_avx(auVar56,auVar51);
                              auVar56 = vcmpps_avx(auVar56,auVar75,2);
                              auVar65 = vorps_avx(auVar65,auVar56);
                              auVar56 = auVar144 & auVar65;
                              auVar65 = vandps_avx(auVar65,auVar144);
                              if ((((auVar56 >> 0x1f & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0 ||
                                   (auVar56 >> 0x3f & (undefined1  [16])0x1) !=
                                   (undefined1  [16])0x0) ||
                                  (auVar56 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                  ) || auVar56[0xf] < '\0') {
                                auVar52._0_4_ = fVar230 * fVar46;
                                auVar52._4_4_ = fVar234 * fVar2;
                                auVar52._8_4_ = fVar235 * fVar3;
                                auVar52._12_4_ = fVar236 * fVar11;
                                auVar76._0_4_ = fVar220 * fVar67;
                                auVar76._4_4_ = fVar199 * fVar188;
                                auVar76._8_4_ = fVar202 * fVar200;
                                auVar76._12_4_ = fVar204 * fVar12;
                                auVar64 = vsubps_avx(auVar76,auVar52);
                                auVar97._0_4_ = fVar223 * fVar220;
                                auVar97._4_4_ = fVar226 * fVar199;
                                auVar97._8_4_ = fVar227 * fVar202;
                                auVar97._12_4_ = fVar229 * fVar204;
                                auVar151._0_4_ = fVar230 * fVar205;
                                auVar151._4_4_ = fVar234 * fVar210;
                                auVar151._8_4_ = fVar235 * fVar211;
                                auVar151._12_4_ = fVar236 * fVar212;
                                auVar143 = vsubps_avx(auVar151,auVar97);
                                auVar56 = vandps_avx(auVar192,auVar52);
                                auVar158 = vandps_avx(auVar192,auVar97);
                                auVar56 = vcmpps_avx(auVar56,auVar158,1);
                                auVar64 = vblendvps_avx(auVar143,auVar64,auVar56);
                                auVar53._0_4_ = fVar172 * fVar205;
                                auVar53._4_4_ = fVar184 * fVar210;
                                auVar53._8_4_ = fVar185 * fVar211;
                                auVar53._12_4_ = fVar186 * fVar212;
                                auVar77._0_4_ = fVar172 * fVar46;
                                auVar77._4_4_ = fVar184 * fVar2;
                                auVar77._8_4_ = fVar185 * fVar3;
                                auVar77._12_4_ = fVar186 * fVar11;
                                auVar135._0_4_ = fVar220 * fVar68;
                                auVar135._4_4_ = fVar199 * fVar187;
                                auVar135._8_4_ = fVar202 * fVar198;
                                auVar135._12_4_ = fVar204 * fVar201;
                                auVar143 = vsubps_avx(auVar77,auVar135);
                                auVar152._0_4_ = fVar246 * fVar220;
                                auVar152._4_4_ = fVar92 * fVar199;
                                auVar152._8_4_ = fVar113 * fVar202;
                                auVar152._12_4_ = fVar114 * fVar204;
                                auVar57 = vsubps_avx(auVar152,auVar53);
                                auVar56 = vandps_avx(auVar192,auVar135);
                                auVar158 = vandps_avx(auVar192,auVar53);
                                auVar56 = vcmpps_avx(auVar56,auVar158,1);
                                auVar143 = vblendvps_avx(auVar57,auVar143,auVar56);
                                auVar54._0_4_ = fVar246 * fVar230;
                                auVar54._4_4_ = fVar92 * fVar234;
                                auVar54._8_4_ = fVar113 * fVar235;
                                auVar54._12_4_ = fVar114 * fVar236;
                                auVar78._0_4_ = fVar230 * fVar68;
                                auVar78._4_4_ = fVar234 * fVar187;
                                auVar78._8_4_ = fVar235 * fVar198;
                                auVar78._12_4_ = fVar236 * fVar201;
                                auVar153._0_4_ = fVar172 * fVar67;
                                auVar153._4_4_ = fVar184 * fVar188;
                                auVar153._8_4_ = fVar185 * fVar200;
                                auVar153._12_4_ = fVar186 * fVar12;
                                auVar178._0_4_ = fVar172 * fVar223;
                                auVar178._4_4_ = fVar184 * fVar226;
                                auVar178._8_4_ = fVar185 * fVar227;
                                auVar178._12_4_ = fVar186 * fVar229;
                                auVar57 = vsubps_avx(auVar78,auVar153);
                                auVar47 = vsubps_avx(auVar178,auVar54);
                                auVar56 = vandps_avx(auVar192,auVar153);
                                auVar158 = vandps_avx(auVar192,auVar54);
                                auVar56 = vcmpps_avx(auVar56,auVar158,1);
                                auVar158 = vblendvps_avx(auVar47,auVar57,auVar56);
                                local_1bf8 = auVar20._0_4_;
                                fStack_1bf4 = auVar20._4_4_;
                                fStack_1bf0 = auVar20._8_4_;
                                local_1be8 = auVar21._0_4_;
                                fStack_1be4 = auVar21._4_4_;
                                fStack_1be0 = auVar21._8_4_;
                                fVar46 = auVar64._0_4_ * local_1be8 +
                                         auVar158._0_4_ * local_1bf8 +
                                         auVar143._0_4_ * (float)local_1c48._0_4_;
                                fVar67 = auVar64._4_4_ * fStack_1be4 +
                                         auVar158._4_4_ * fStack_1bf4 +
                                         auVar143._4_4_ * (float)local_1c48._4_4_;
                                fVar68 = auVar64._8_4_ * fStack_1be0 +
                                         auVar158._8_4_ * fStack_1bf0 + auVar143._8_4_ * fStack_1c40
                                ;
                                fVar172 = auVar64._12_4_ * fVar70 +
                                          auVar158._12_4_ * fVar222 + auVar143._12_4_ * fVar248;
                                auVar55._0_4_ = fVar46 + fVar46;
                                auVar55._4_4_ = fVar67 + fVar67;
                                auVar55._8_4_ = fVar68 + fVar68;
                                auVar55._12_4_ = fVar172 + fVar172;
                                fVar46 = auVar64._0_4_ * fVar237 +
                                         auVar158._0_4_ * fVar9 + auVar143._0_4_ * fVar245;
                                fVar67 = auVar64._4_4_ * fVar240 +
                                         auVar158._4_4_ * fVar10 + auVar143._4_4_ * fVar247;
                                fVar68 = auVar64._8_4_ * fVar241 +
                                         auVar158._8_4_ * fVar69 + auVar143._8_4_ * fVar249;
                                fVar172 = auVar64._12_4_ * fVar242 +
                                          auVar158._12_4_ * fVar91 + auVar143._12_4_ * fVar254;
                                auVar56 = vrcpps_avx(auVar55);
                                fVar9 = auVar56._0_4_;
                                auVar179._0_4_ = auVar55._0_4_ * fVar9;
                                fVar10 = auVar56._4_4_;
                                auVar179._4_4_ = auVar55._4_4_ * fVar10;
                                fVar69 = auVar56._8_4_;
                                auVar179._8_4_ = auVar55._8_4_ * fVar69;
                                fVar91 = auVar56._12_4_;
                                auVar179._12_4_ = auVar55._12_4_ * fVar91;
                                auVar193._8_4_ = 0x3f800000;
                                auVar193._0_8_ = &DAT_3f8000003f800000;
                                auVar193._12_4_ = 0x3f800000;
                                auVar56 = vsubps_avx(auVar193,auVar179);
                                auVar79._0_4_ = (fVar46 + fVar46) * (fVar9 + fVar9 * auVar56._0_4_);
                                auVar79._4_4_ =
                                     (fVar67 + fVar67) * (fVar10 + fVar10 * auVar56._4_4_);
                                auVar79._8_4_ =
                                     (fVar68 + fVar68) * (fVar69 + fVar69 * auVar56._8_4_);
                                auVar79._12_4_ =
                                     (fVar172 + fVar172) * (fVar91 + fVar91 * auVar56._12_4_);
                                auVar56 = vcmpps_avx(auVar79,*(undefined1 (*) [16])(ray + 0x80),2);
                                auVar183 = ZEXT1664(auVar56);
                                auVar57 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar79,2);
                                auVar56 = vandps_avx(auVar57,auVar56);
                                auVar57 = vcmpps_avx(auVar55,_DAT_01feba10,4);
                                auVar56 = vandps_avx(auVar57,auVar56);
                                auVar56 = vpslld_avx(auVar56,0x1f);
                                auVar57 = vpsrad_avx(auVar56,0x1f);
                                auVar56 = auVar65 & auVar57;
                                auVar65 = vandps_avx(auVar57,auVar65);
                                if ((((auVar56 >> 0x1f & (undefined1  [16])0x1) !=
                                      (undefined1  [16])0x0 ||
                                     (auVar56 >> 0x3f & (undefined1  [16])0x1) !=
                                     (undefined1  [16])0x0) ||
                                    (auVar56 >> 0x5f & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) || auVar56[0xf] < '\0') {
                                  uStack_1700 = auVar215._8_8_;
                                  uStack_1760 = uStack_1700;
                                  local_17c8 = auVar158;
                                  local_17b8 = auVar143;
                                  local_17a8 = auVar64;
                                  local_1798 = auVar79;
                                  local_1788 = auVar134;
                                  _local_1778 = auVar163;
                                  local_1768 = auVar215._0_8_;
                                }
                              }
                              uVar26 = *(undefined4 *)(local_1b90 + lVar43);
                              local_1b28._4_4_ = uVar26;
                              local_1b28._0_4_ = uVar26;
                              local_1b28._8_4_ = uVar26;
                              local_1b28._12_4_ = uVar26;
                              fVar9 = *(float *)(local_1ba0 + lVar43);
                              fVar10 = *(float *)(local_1b98 + lVar43);
                              uVar26 = *(undefined4 *)(local_1b88 + lVar43 + 0x30);
                              local_1b38._4_4_ = uVar26;
                              local_1b38._0_4_ = uVar26;
                              local_1b38._8_4_ = uVar26;
                              local_1b38._12_4_ = uVar26;
                              uVar26 = *(undefined4 *)(local_1b80 + lVar43 + 0x30);
                              local_1b48._4_4_ = uVar26;
                              local_1b48._0_4_ = uVar26;
                              local_1b48._8_4_ = uVar26;
                              local_1b48._12_4_ = uVar26;
                              uVar26 = *(undefined4 *)(local_1b78 + lVar43 + 0x30);
                              local_1b58._4_4_ = uVar26;
                              local_1b58._0_4_ = uVar26;
                              local_1b58._8_4_ = uVar26;
                              local_1b58._12_4_ = uVar26;
                              pGVar4 = (context->scene->geometries).items
                                       [(pre.super_Precalculations.grid)->_geomID].ptr;
                              uVar22 = pGVar4->mask;
                              auVar80._4_4_ = uVar22;
                              auVar80._0_4_ = uVar22;
                              auVar80._8_4_ = uVar22;
                              auVar80._12_4_ = uVar22;
                              auVar56 = vandps_avx(auVar80,*(undefined1 (*) [16])(ray + 0x90));
                              auVar56 = vpcmpeqd_avx(auVar56,_DAT_01feba10);
                              auVar158 = auVar65 & ~auVar56;
                              auVar64 = local_1b38;
                              auVar143 = local_1b48;
                              auVar57 = local_1b58;
                              auVar47 = local_1b28;
                              if ((((auVar158 >> 0x1f & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0 ||
                                   (auVar158 >> 0x3f & (undefined1  [16])0x1) !=
                                   (undefined1  [16])0x0) ||
                                  (auVar158 >> 0x5f & (undefined1  [16])0x1) !=
                                  (undefined1  [16])0x0) || auVar158[0xf] < '\0') {
                                auVar65 = vandnps_avx(auVar56,auVar65);
                                if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                   (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                                  auVar86._8_4_ = 0x7fffffff;
                                  auVar86._0_8_ = 0x7fffffff7fffffff;
                                  auVar86._12_4_ = 0x7fffffff;
                                  auVar56 = vandps_avx(local_1788,auVar86);
                                  auVar158 = vrcpps_avx(local_1788);
                                  fVar69 = auVar158._0_4_;
                                  auVar123._0_4_ = local_1788._0_4_ * fVar69;
                                  fVar91 = auVar158._4_4_;
                                  auVar123._4_4_ = local_1788._4_4_ * fVar91;
                                  fVar46 = auVar158._8_4_;
                                  auVar123._8_4_ = local_1788._8_4_ * fVar46;
                                  fVar67 = auVar158._12_4_;
                                  auVar123._12_4_ = local_1788._12_4_ * fVar67;
                                  auVar167._8_4_ = 0x3f800000;
                                  auVar167._0_8_ = &DAT_3f8000003f800000;
                                  auVar167._12_4_ = 0x3f800000;
                                  auVar158 = vsubps_avx(auVar167,auVar123);
                                  auVar104._0_4_ = fVar69 + fVar69 * auVar158._0_4_;
                                  auVar104._4_4_ = fVar91 + fVar91 * auVar158._4_4_;
                                  auVar104._8_4_ = fVar46 + fVar46 * auVar158._8_4_;
                                  auVar104._12_4_ = fVar67 + fVar67 * auVar158._12_4_;
                                  auVar124._8_4_ = 0x219392ef;
                                  auVar124._0_8_ = 0x219392ef219392ef;
                                  auVar124._12_4_ = 0x219392ef;
                                  auVar56 = vcmpps_avx(auVar56,auVar124,5);
                                  auVar56 = vandps_avx(auVar56,auVar104);
                                  auVar87._0_4_ = auVar56._0_4_ * (float)local_1768;
                                  auVar87._4_4_ = auVar56._4_4_ * local_1768._4_4_;
                                  auVar87._8_4_ = auVar56._8_4_ * (float)uStack_1760;
                                  auVar87._12_4_ = auVar56._12_4_ * uStack_1760._4_4_;
                                  auVar206 = vminps_avx(auVar87,auVar167);
                                  auVar105._0_4_ = auVar56._0_4_ * (float)local_1778._0_4_;
                                  auVar105._4_4_ = auVar56._4_4_ * (float)local_1778._4_4_;
                                  auVar105._8_4_ = auVar56._8_4_ * fStack_1770;
                                  auVar105._12_4_ = auVar56._12_4_ * fStack_176c;
                                  auVar57 = vminps_avx(auVar105,auVar167);
                                  uVar26 = *(undefined4 *)(pcVar35 + lVar43 + -4);
                                  auVar125._4_4_ = uVar26;
                                  auVar125._0_4_ = uVar26;
                                  auVar125._8_4_ = uVar26;
                                  auVar125._12_4_ = uVar26;
                                  uVar26 = *(undefined4 *)(pcVar38 + lVar43 + 0x2c);
                                  auVar138._4_4_ = uVar26;
                                  auVar138._0_4_ = uVar26;
                                  auVar138._8_4_ = uVar26;
                                  auVar138._12_4_ = uVar26;
                                  auVar158 = vpsrld_avx(auVar125,0x10);
                                  auVar47 = ZEXT816(0) << 0x40;
                                  auVar183 = ZEXT1664(auVar47);
                                  auVar56 = vpblendw_avx(auVar125,auVar47,0xaa);
                                  auVar56 = vcvtdq2ps_avx(auVar56);
                                  auVar158 = vcvtdq2ps_avx(auVar158);
                                  auVar160 = vsubps_avx(auVar167,auVar206);
                                  auVar94 = vsubps_avx(auVar160,auVar57);
                                  auVar160 = vpblendw_avx(auVar138,auVar47,0xaa);
                                  auVar160 = vcvtdq2ps_avx(auVar160);
                                  auVar141 = vpsrld_avx(auVar138,0x10);
                                  auVar141 = vcvtdq2ps_avx(auVar141);
                                  uVar26 = *(undefined4 *)(pcVar35 + lVar43);
                                  auVar139._4_4_ = uVar26;
                                  auVar139._0_4_ = uVar26;
                                  auVar139._8_4_ = uVar26;
                                  auVar139._12_4_ = uVar26;
                                  auVar64 = vpblendw_avx(auVar139,auVar47,0xaa);
                                  auVar64 = vcvtdq2ps_avx(auVar64);
                                  auVar143 = vpsrld_avx(auVar139,0x10);
                                  auVar143 = vcvtdq2ps_avx(auVar143);
                                  local_1a08 = local_17a8._0_8_;
                                  uStack_1a00 = local_17a8._8_8_;
                                  local_19f8 = local_17b8._0_8_;
                                  uStack_19f0 = local_17b8._8_8_;
                                  local_19e8 = local_17c8._0_8_;
                                  uStack_19e0 = local_17c8._8_8_;
                                  local_19d8 = auVar206._0_4_ * auVar64._0_4_ * 0.00012207031 +
                                               auVar94._0_4_ * auVar56._0_4_ * 0.00012207031 +
                                               auVar57._0_4_ * auVar160._0_4_ * 0.00012207031;
                                  fStack_19d4 = auVar206._4_4_ * auVar64._4_4_ * 0.00012207031 +
                                                auVar94._4_4_ * auVar56._4_4_ * 0.00012207031 +
                                                auVar57._4_4_ * auVar160._4_4_ * 0.00012207031;
                                  fStack_19d0 = auVar206._8_4_ * auVar64._8_4_ * 0.00012207031 +
                                                auVar94._8_4_ * auVar56._8_4_ * 0.00012207031 +
                                                auVar57._8_4_ * auVar160._8_4_ * 0.00012207031;
                                  fStack_19cc = auVar206._12_4_ * auVar64._12_4_ * 0.00012207031 +
                                                auVar94._12_4_ * auVar56._12_4_ * 0.00012207031 +
                                                auVar57._12_4_ * auVar160._12_4_ * 0.00012207031;
                                  local_19a8 = vpshufd_avx(ZEXT416((pre.super_Precalculations.grid)
                                                                   ->_geomID),0);
                                  local_19c8 = auVar206._0_4_ * auVar143._0_4_ * 0.00012207031 +
                                               auVar94._0_4_ * auVar158._0_4_ * 0.00012207031 +
                                               auVar57._0_4_ * auVar141._0_4_ * 0.00012207031;
                                  fStack_19c4 = auVar206._4_4_ * auVar143._4_4_ * 0.00012207031 +
                                                auVar94._4_4_ * auVar158._4_4_ * 0.00012207031 +
                                                auVar57._4_4_ * auVar141._4_4_ * 0.00012207031;
                                  fStack_19c0 = auVar206._8_4_ * auVar143._8_4_ * 0.00012207031 +
                                                auVar94._8_4_ * auVar158._8_4_ * 0.00012207031 +
                                                auVar57._8_4_ * auVar141._8_4_ * 0.00012207031;
                                  fStack_19bc = auVar206._12_4_ * auVar143._12_4_ * 0.00012207031 +
                                                auVar94._12_4_ * auVar158._12_4_ * 0.00012207031 +
                                                auVar57._12_4_ * auVar141._12_4_ * 0.00012207031;
                                  local_19b8 = vpshufd_avx(ZEXT416((pre.super_Precalculations.grid)
                                                                   ->_primID),0);
                                  vcmpps_avx(ZEXT1632(local_19b8),ZEXT1632(local_19b8),0xf);
                                  uStack_1994 = context->user->instID[0];
                                  local_1998 = uStack_1994;
                                  uStack_1990 = uStack_1994;
                                  uStack_198c = uStack_1994;
                                  uStack_1988 = context->user->instPrimID[0];
                                  uStack_1984 = uStack_1988;
                                  uStack_1980 = uStack_1988;
                                  uStack_197c = uStack_1988;
                                  local_1b68 = *(undefined1 (*) [16])(ray + 0x80);
                                  auVar56 = vblendvps_avx(local_1b68,local_1798,auVar65);
                                  *(undefined1 (*) [16])(ray + 0x80) = auVar56;
                                  args.valid = (int *)local_1bc8;
                                  args.geometryUserPtr = pGVar4->userPtr;
                                  args.context = context->user;
                                  args.hit = (RTCHitN *)&local_1a08;
                                  args.N = 4;
                                  local_1bc8 = auVar65;
                                  args.ray = (RTCRayN *)ray;
                                  if (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                                    auVar183 = ZEXT1664(auVar47);
                                    (*pGVar4->occlusionFilterN)(&args);
                                  }
                                  if (local_1bc8 == (undefined1  [16])0x0) {
                                    auVar65 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                                    auVar65 = auVar65 ^ _DAT_01febe20;
                                  }
                                  else {
                                    p_Var5 = context->args->filter;
                                    if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                                       (((context->args->flags &
                                         RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                        (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                                      auVar183 = ZEXT1664(auVar183._0_16_);
                                      (*p_Var5)(&args);
                                    }
                                    auVar56 = vpcmpeqd_avx((undefined1  [16])0x0,local_1bc8);
                                    auVar65 = auVar56 ^ _DAT_01febe20;
                                    auVar106._8_4_ = 0xff800000;
                                    auVar106._0_8_ = 0xff800000ff800000;
                                    auVar106._12_4_ = 0xff800000;
                                    auVar56 = vblendvps_avx(auVar106,*(undefined1 (*) [16])
                                                                      (args.ray + 0x80),auVar56);
                                    *(undefined1 (*) [16])(args.ray + 0x80) = auVar56;
                                  }
                                  auVar56 = vpslld_avx(auVar65,0x1f);
                                  auVar65 = vpsrad_avx(auVar56,0x1f);
                                  auVar56 = vblendvps_avx(local_1b68,
                                                          *(undefined1 (*) [16])local_1bb0,auVar56);
                                  *(undefined1 (*) [16])local_1bb0 = auVar56;
                                  auVar206 = local_1b58;
                                  auVar94 = local_1b48;
                                  auVar141 = local_1b38;
                                  auVar160 = local_1b28;
                                  auVar64 = local_1b38;
                                  auVar143 = local_1b48;
                                  auVar57 = local_1b58;
                                  auVar47 = local_1b28;
                                }
                                local_1b28 = auVar160;
                                local_1b38 = auVar141;
                                local_1b48 = auVar94;
                                local_1b58 = auVar206;
                                auVar144 = vpandn_avx(auVar65,auVar144);
                                auVar206 = local_1b58;
                                auVar94 = local_1b48;
                                auVar141 = local_1b38;
                                auVar160 = local_1b28;
                              }
                              local_1b28 = auVar160;
                              local_1b38 = auVar141;
                              local_1b48 = auVar94;
                              local_1b58 = auVar206;
                              if ((((auVar144 >> 0x1f & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0 &&
                                   (auVar144 >> 0x3f & (undefined1  [16])0x1) ==
                                   (undefined1  [16])0x0) &&
                                  (auVar144 >> 0x5f & (undefined1  [16])0x1) ==
                                  (undefined1  [16])0x0) && -1 < auVar144[0xf]) {
                                bVar45 = false;
                              }
                              else {
                                auVar232._0_4_ =
                                     auVar47._0_4_ * local_1a38 + auVar64._0_4_ * local_1a28;
                                auVar232._4_4_ =
                                     auVar47._4_4_ * fStack_1a34 + auVar64._4_4_ * fStack_1a24;
                                auVar232._8_4_ =
                                     auVar47._8_4_ * fStack_1a30 + auVar64._8_4_ * fStack_1a20;
                                auVar232._12_4_ =
                                     auVar47._12_4_ * fStack_1a2c + auVar64._12_4_ * fStack_1a1c;
                                auVar154._0_4_ = fVar9 * local_1a38 + auVar143._0_4_ * local_1a28;
                                auVar154._4_4_ = fVar9 * fStack_1a34 + auVar143._4_4_ * fStack_1a24;
                                auVar154._8_4_ = fVar9 * fStack_1a30 + auVar143._8_4_ * fStack_1a20;
                                auVar154._12_4_ =
                                     fVar9 * fStack_1a2c + auVar143._12_4_ * fStack_1a1c;
                                auVar164._0_4_ = fVar10 * local_1a38 + auVar57._0_4_ * local_1a28;
                                auVar164._4_4_ = fVar10 * fStack_1a34 + auVar57._4_4_ * fStack_1a24;
                                auVar164._8_4_ = fVar10 * fStack_1a30 + auVar57._8_4_ * fStack_1a20;
                                auVar164._12_4_ =
                                     fVar10 * fStack_1a2c + auVar57._12_4_ * fStack_1a1c;
                                auVar65 = *(undefined1 (*) [16])ray;
                                auVar56 = *(undefined1 (*) [16])(ray + 0x10);
                                auVar158 = *(undefined1 (*) [16])(ray + 0x20);
                                auVar160 = vsubps_avx(auVar214,auVar65);
                                auVar141 = vsubps_avx(auVar48,auVar56);
                                auVar64 = vsubps_avx(auVar73,auVar158);
                                auVar143 = vsubps_avx(_local_1c28,auVar65);
                                auVar15._4_4_ = fStack_1b14;
                                auVar15._0_4_ = local_1b18;
                                auVar15._8_4_ = fStack_1b10;
                                auVar15._12_4_ = fStack_1b0c;
                                auVar206 = vsubps_avx(auVar15,auVar56);
                                auVar57 = vsubps_avx(_local_1a88,auVar158);
                                auVar94 = vsubps_avx(auVar232,auVar65);
                                auVar56 = vsubps_avx(auVar154,auVar56);
                                auVar158 = vsubps_avx(auVar164,auVar158);
                                local_1b28 = vsubps_avx(auVar94,auVar160);
                                local_1b38 = vsubps_avx(auVar56,auVar141);
                                local_1b48 = vsubps_avx(auVar158,auVar64);
                                fVar227 = auVar141._0_4_;
                                fVar68 = fVar227 + auVar56._0_4_;
                                fVar230 = auVar141._4_4_;
                                fVar172 = fVar230 + auVar56._4_4_;
                                fVar235 = auVar141._8_4_;
                                fVar187 = fVar235 + auVar56._8_4_;
                                fVar237 = auVar141._12_4_;
                                fVar184 = fVar237 + auVar56._12_4_;
                                fVar247 = auVar64._0_4_;
                                fVar188 = fVar247 + auVar158._0_4_;
                                fVar254 = auVar64._4_4_;
                                fVar200 = fVar254 + auVar158._4_4_;
                                fVar257 = auVar64._8_4_;
                                fVar198 = fVar257 + auVar158._8_4_;
                                fVar260 = auVar64._12_4_;
                                fVar185 = fVar260 + auVar158._12_4_;
                                fVar241 = local_1b48._0_4_;
                                auVar208._0_4_ = fVar241 * fVar68;
                                fVar242 = local_1b48._4_4_;
                                auVar208._4_4_ = fVar242 * fVar172;
                                fVar245 = local_1b48._8_4_;
                                auVar208._8_4_ = fVar245 * fVar187;
                                fVar246 = local_1b48._12_4_;
                                auVar208._12_4_ = fVar246 * fVar184;
                                fVar46 = local_1b38._0_4_;
                                auVar216._0_4_ = fVar188 * fVar46;
                                fVar2 = local_1b38._4_4_;
                                auVar216._4_4_ = fVar200 * fVar2;
                                fVar3 = local_1b38._8_4_;
                                auVar216._8_4_ = fVar198 * fVar3;
                                fVar11 = local_1b38._12_4_;
                                auVar216._12_4_ = fVar185 * fVar11;
                                auVar47 = vsubps_avx(auVar216,auVar208);
                                fVar9 = auVar160._0_4_;
                                fVar201 = auVar94._0_4_ + fVar9;
                                fVar10 = auVar160._4_4_;
                                fVar186 = auVar94._4_4_ + fVar10;
                                fVar69 = auVar160._8_4_;
                                fVar203 = auVar94._8_4_ + fVar69;
                                fVar91 = auVar160._12_4_;
                                fVar218 = auVar94._12_4_ + fVar91;
                                fVar67 = local_1b28._0_4_;
                                auVar194._0_4_ = fVar188 * fVar67;
                                fVar188 = local_1b28._4_4_;
                                auVar194._4_4_ = fVar200 * fVar188;
                                fVar200 = local_1b28._8_4_;
                                auVar194._8_4_ = fVar198 * fVar200;
                                fVar12 = local_1b28._12_4_;
                                auVar194._12_4_ = fVar185 * fVar12;
                                auVar217._0_4_ = fVar201 * fVar241;
                                auVar217._4_4_ = fVar186 * fVar242;
                                auVar217._8_4_ = fVar203 * fVar245;
                                auVar217._12_4_ = fVar218 * fVar246;
                                auVar14 = vsubps_avx(auVar217,auVar194);
                                auVar195._0_4_ = fVar201 * fVar46;
                                auVar195._4_4_ = fVar186 * fVar2;
                                auVar195._8_4_ = fVar203 * fVar3;
                                auVar195._12_4_ = fVar218 * fVar11;
                                auVar165._0_4_ = fVar67 * fVar68;
                                auVar165._4_4_ = fVar188 * fVar172;
                                auVar165._8_4_ = fVar200 * fVar187;
                                auVar165._12_4_ = fVar12 * fVar184;
                                auVar49 = vsubps_avx(auVar165,auVar195);
                                auVar65 = *(undefined1 (*) [16])(ray + 0x60);
                                fVar68 = auVar65._0_4_;
                                fVar187 = auVar65._4_4_;
                                fVar198 = auVar65._8_4_;
                                fVar201 = auVar65._12_4_;
                                fVar203 = *(float *)(ray + 0x50);
                                fVar218 = *(float *)(ray + 0x54);
                                fVar221 = *(float *)(ray + 0x58);
                                auVar20 = *(undefined1 (*) [12])(ray + 0x50);
                                fVar222 = *(float *)(ray + 0x5c);
                                local_1b18 = *(float *)(ray + 0x40);
                                fStack_1b14 = *(float *)(ray + 0x44);
                                fStack_1b10 = *(float *)(ray + 0x48);
                                auVar19 = *(undefined1 (*) [12])(ray + 0x40);
                                fStack_1b0c = *(float *)(ray + 0x4c);
                                fVar115 = auVar47._0_4_ * local_1b18 +
                                          fVar203 * auVar14._0_4_ + auVar49._0_4_ * fVar68;
                                fVar220 = auVar47._4_4_ * fStack_1b14 +
                                          fVar218 * auVar14._4_4_ + auVar49._4_4_ * fVar187;
                                local_1b68._0_8_ = CONCAT44(fVar220,fVar115);
                                local_1b68._8_4_ =
                                     auVar47._8_4_ * fStack_1b10 +
                                     fVar221 * auVar14._8_4_ + auVar49._8_4_ * fVar198;
                                local_1b68._12_4_ =
                                     auVar47._12_4_ * fStack_1b0c +
                                     fVar222 * auVar14._12_4_ + auVar49._12_4_ * fVar201;
                                local_1b58 = vsubps_avx(auVar141,auVar206);
                                auVar65 = vsubps_avx(auVar64,auVar57);
                                fVar172 = fVar227 + auVar206._0_4_;
                                fVar184 = fVar230 + auVar206._4_4_;
                                fVar185 = fVar235 + auVar206._8_4_;
                                fVar186 = fVar237 + auVar206._12_4_;
                                fVar248 = fVar247 + auVar57._0_4_;
                                fVar255 = fVar254 + auVar57._4_4_;
                                fVar258 = fVar257 + auVar57._8_4_;
                                fVar261 = fVar260 + auVar57._12_4_;
                                fVar199 = auVar65._0_4_;
                                auVar239._0_4_ = fVar199 * fVar172;
                                fVar202 = auVar65._4_4_;
                                auVar239._4_4_ = fVar202 * fVar184;
                                fVar204 = auVar65._8_4_;
                                auVar239._8_4_ = fVar204 * fVar185;
                                fVar205 = auVar65._12_4_;
                                auVar239._12_4_ = fVar205 * fVar186;
                                fVar210 = local_1b58._0_4_;
                                auVar98._0_4_ = fVar210 * fVar248;
                                fVar212 = local_1b58._4_4_;
                                auVar98._4_4_ = fVar212 * fVar255;
                                fVar219 = local_1b58._8_4_;
                                auVar98._8_4_ = fVar219 * fVar258;
                                fVar226 = local_1b58._12_4_;
                                auVar98._12_4_ = fVar226 * fVar261;
                                auVar65 = vsubps_avx(auVar98,auVar239);
                                auVar160 = vsubps_avx(auVar160,auVar143);
                                fVar229 = auVar160._0_4_;
                                auVar251._0_4_ = fVar229 * fVar248;
                                fVar234 = auVar160._4_4_;
                                auVar251._4_4_ = fVar234 * fVar255;
                                fVar236 = auVar160._8_4_;
                                auVar251._8_4_ = fVar236 * fVar258;
                                fVar240 = auVar160._12_4_;
                                auVar251._12_4_ = fVar240 * fVar261;
                                fVar248 = auVar143._0_4_ + fVar9;
                                fVar255 = auVar143._4_4_ + fVar10;
                                fVar258 = auVar143._8_4_ + fVar69;
                                fVar261 = auVar143._12_4_ + fVar91;
                                auVar196._0_4_ = fVar199 * fVar248;
                                auVar196._4_4_ = fVar202 * fVar255;
                                auVar196._8_4_ = fVar204 * fVar258;
                                auVar196._12_4_ = fVar205 * fVar261;
                                auVar160 = vsubps_avx(auVar196,auVar251);
                                auVar180._0_4_ = fVar210 * fVar248;
                                auVar180._4_4_ = fVar212 * fVar255;
                                auVar180._8_4_ = fVar219 * fVar258;
                                auVar180._12_4_ = fVar226 * fVar261;
                                auVar166._0_4_ = fVar229 * fVar172;
                                auVar166._4_4_ = fVar234 * fVar184;
                                auVar166._8_4_ = fVar236 * fVar185;
                                auVar166._12_4_ = fVar240 * fVar186;
                                auVar141 = vsubps_avx(auVar166,auVar180);
                                fVar211 = auVar19._0_4_;
                                fVar213 = auVar19._4_4_;
                                fVar223 = auVar19._8_4_;
                                auVar181._0_4_ =
                                     fVar211 * auVar65._0_4_ +
                                     auVar141._0_4_ * fVar68 + fVar203 * auVar160._0_4_;
                                auVar181._4_4_ =
                                     fVar213 * auVar65._4_4_ +
                                     auVar141._4_4_ * fVar187 + fVar218 * auVar160._4_4_;
                                auVar181._8_4_ =
                                     fVar223 * auVar65._8_4_ +
                                     auVar141._8_4_ * fVar198 + fVar221 * auVar160._8_4_;
                                auVar181._12_4_ =
                                     fStack_1b0c * auVar65._12_4_ +
                                     auVar141._12_4_ * fVar201 + fVar222 * auVar160._12_4_;
                                auVar183 = ZEXT1664(auVar181);
                                auVar65 = vsubps_avx(auVar143,auVar94);
                                fVar70 = auVar143._0_4_ + auVar94._0_4_;
                                fVar159 = auVar143._4_4_ + auVar94._4_4_;
                                fVar169 = auVar143._8_4_ + auVar94._8_4_;
                                fVar170 = auVar143._12_4_ + auVar94._12_4_;
                                auVar160 = vsubps_avx(auVar206,auVar56);
                                fVar248 = auVar206._0_4_ + auVar56._0_4_;
                                fVar255 = auVar206._4_4_ + auVar56._4_4_;
                                fVar258 = auVar206._8_4_ + auVar56._8_4_;
                                fVar261 = auVar206._12_4_ + auVar56._12_4_;
                                auVar56 = vsubps_avx(auVar57,auVar158);
                                fVar171 = auVar57._0_4_ + auVar158._0_4_;
                                fVar228 = auVar57._4_4_ + auVar158._4_4_;
                                fVar253 = auVar57._8_4_ + auVar158._8_4_;
                                fVar256 = auVar57._12_4_ + auVar158._12_4_;
                                auVar209._8_4_ = 0x7fffffff;
                                auVar209._0_8_ = 0x7fffffff7fffffff;
                                auVar209._12_4_ = 0x7fffffff;
                                fVar172 = auVar56._0_4_;
                                auVar120._0_4_ = fVar248 * fVar172;
                                fVar184 = auVar56._4_4_;
                                auVar120._4_4_ = fVar255 * fVar184;
                                fVar185 = auVar56._8_4_;
                                auVar120._8_4_ = fVar258 * fVar185;
                                fVar186 = auVar56._12_4_;
                                auVar120._12_4_ = fVar261 * fVar186;
                                fVar259 = auVar160._0_4_;
                                auVar155._0_4_ = fVar259 * fVar171;
                                fVar92 = auVar160._4_4_;
                                auVar155._4_4_ = fVar92 * fVar228;
                                fVar113 = auVar160._8_4_;
                                auVar155._8_4_ = fVar113 * fVar253;
                                fVar114 = auVar160._12_4_;
                                auVar155._12_4_ = fVar114 * fVar256;
                                auVar56 = vsubps_avx(auVar155,auVar120);
                                fVar249 = auVar65._0_4_;
                                auVar99._0_4_ = fVar249 * fVar171;
                                fVar171 = auVar65._4_4_;
                                auVar99._4_4_ = fVar171 * fVar228;
                                fVar228 = auVar65._8_4_;
                                auVar99._8_4_ = fVar228 * fVar253;
                                fVar253 = auVar65._12_4_;
                                auVar99._12_4_ = fVar253 * fVar256;
                                auVar156._0_4_ = fVar70 * fVar172;
                                auVar156._4_4_ = fVar159 * fVar184;
                                auVar156._8_4_ = fVar169 * fVar185;
                                auVar156._12_4_ = fVar170 * fVar186;
                                auVar65 = vsubps_avx(auVar156,auVar99);
                                auVar81._0_4_ = fVar70 * fVar259;
                                auVar81._4_4_ = fVar159 * fVar92;
                                auVar81._8_4_ = fVar169 * fVar113;
                                auVar81._12_4_ = fVar170 * fVar114;
                                auVar58._0_4_ = fVar249 * fVar248;
                                auVar58._4_4_ = fVar171 * fVar255;
                                auVar58._8_4_ = fVar228 * fVar258;
                                auVar58._12_4_ = fVar253 * fVar261;
                                auVar158 = vsubps_avx(auVar58,auVar81);
                                auVar59._0_4_ =
                                     fVar211 * auVar56._0_4_ +
                                     fVar68 * auVar158._0_4_ + fVar203 * auVar65._0_4_;
                                auVar59._4_4_ =
                                     fVar213 * auVar56._4_4_ +
                                     fVar187 * auVar158._4_4_ + fVar218 * auVar65._4_4_;
                                auVar59._8_4_ =
                                     fVar223 * auVar56._8_4_ +
                                     fVar198 * auVar158._8_4_ + fVar221 * auVar65._8_4_;
                                auVar59._12_4_ =
                                     fStack_1b0c * auVar56._12_4_ +
                                     fVar201 * auVar158._12_4_ + fVar222 * auVar65._12_4_;
                                auVar233._0_4_ = auVar59._0_4_ + fVar115 + auVar181._0_4_;
                                auVar233._4_4_ = auVar59._4_4_ + fVar220 + auVar181._4_4_;
                                auVar233._8_4_ = auVar59._8_4_ + local_1b68._8_4_ + auVar181._8_4_;
                                auVar233._12_4_ =
                                     auVar59._12_4_ + local_1b68._12_4_ + auVar181._12_4_;
                                auVar65 = vandps_avx(auVar233,auVar209);
                                auVar82._0_4_ = auVar65._0_4_ * 1.1920929e-07;
                                auVar82._4_4_ = auVar65._4_4_ * 1.1920929e-07;
                                auVar82._8_4_ = auVar65._8_4_ * 1.1920929e-07;
                                auVar82._12_4_ = auVar65._12_4_ * 1.1920929e-07;
                                auVar65 = vminps_avx(local_1b68,auVar181);
                                auVar65 = vminps_avx(auVar65,auVar59);
                                uVar29 = CONCAT44(auVar82._4_4_,auVar82._0_4_);
                                auVar121._0_8_ = uVar29 ^ 0x8000000080000000;
                                auVar121._8_4_ = -auVar82._8_4_;
                                auVar121._12_4_ = -auVar82._12_4_;
                                auVar65 = vcmpps_avx(auVar65,auVar121,5);
                                auVar56 = vmaxps_avx(local_1b68,auVar181);
                                auVar56 = vmaxps_avx(auVar56,auVar59);
                                auVar56 = vcmpps_avx(auVar56,auVar82,2);
                                auVar65 = vorps_avx(auVar65,auVar56);
                                auVar56 = auVar144 & auVar65;
                                auVar65 = vandps_avx(auVar65,auVar144);
                                if ((((auVar56 >> 0x1f & (undefined1  [16])0x1) !=
                                      (undefined1  [16])0x0 ||
                                     (auVar56 >> 0x3f & (undefined1  [16])0x1) !=
                                     (undefined1  [16])0x0) ||
                                    (auVar56 >> 0x5f & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) || auVar56[0xf] < '\0') {
                                  auVar60._0_4_ = fVar210 * fVar241;
                                  auVar60._4_4_ = fVar212 * fVar242;
                                  auVar60._8_4_ = fVar219 * fVar245;
                                  auVar60._12_4_ = fVar226 * fVar246;
                                  auVar83._0_4_ = fVar199 * fVar46;
                                  auVar83._4_4_ = fVar202 * fVar2;
                                  auVar83._8_4_ = fVar204 * fVar3;
                                  auVar83._12_4_ = fVar205 * fVar11;
                                  auVar160 = vsubps_avx(auVar83,auVar60);
                                  auVar100._0_4_ = fVar199 * fVar259;
                                  auVar100._4_4_ = fVar202 * fVar92;
                                  auVar100._8_4_ = fVar204 * fVar113;
                                  auVar100._12_4_ = fVar205 * fVar114;
                                  auVar122._0_4_ = fVar210 * fVar172;
                                  auVar122._4_4_ = fVar212 * fVar184;
                                  auVar122._8_4_ = fVar219 * fVar185;
                                  auVar122._12_4_ = fVar226 * fVar186;
                                  auVar141 = vsubps_avx(auVar122,auVar100);
                                  auVar56 = vandps_avx(auVar209,auVar60);
                                  auVar158 = vandps_avx(auVar209,auVar100);
                                  auVar56 = vcmpps_avx(auVar56,auVar158,1);
                                  auVar160 = vblendvps_avx(auVar141,auVar160,auVar56);
                                  auVar61._0_4_ = fVar229 * fVar172;
                                  auVar61._4_4_ = fVar234 * fVar184;
                                  auVar61._8_4_ = fVar236 * fVar185;
                                  auVar61._12_4_ = fVar240 * fVar186;
                                  auVar84._0_4_ = fVar229 * fVar241;
                                  auVar84._4_4_ = fVar234 * fVar242;
                                  auVar84._8_4_ = fVar236 * fVar245;
                                  auVar84._12_4_ = fVar240 * fVar246;
                                  auVar101._0_4_ = fVar199 * fVar67;
                                  auVar101._4_4_ = fVar202 * fVar188;
                                  auVar101._8_4_ = fVar204 * fVar200;
                                  auVar101._12_4_ = fVar205 * fVar12;
                                  auVar141 = vsubps_avx(auVar84,auVar101);
                                  auVar136._0_4_ = fVar249 * fVar199;
                                  auVar136._4_4_ = fVar171 * fVar202;
                                  auVar136._8_4_ = fVar228 * fVar204;
                                  auVar136._12_4_ = fVar253 * fVar205;
                                  auVar64 = vsubps_avx(auVar136,auVar61);
                                  auVar56 = vandps_avx(auVar209,auVar101);
                                  auVar158 = vandps_avx(auVar209,auVar61);
                                  auVar56 = vcmpps_avx(auVar56,auVar158,1);
                                  auVar141 = vblendvps_avx(auVar64,auVar141,auVar56);
                                  auVar62._0_4_ = fVar249 * fVar210;
                                  auVar62._4_4_ = fVar171 * fVar212;
                                  auVar62._8_4_ = fVar228 * fVar219;
                                  auVar62._12_4_ = fVar253 * fVar226;
                                  auVar102._0_4_ = fVar210 * fVar67;
                                  auVar102._4_4_ = fVar212 * fVar188;
                                  auVar102._8_4_ = fVar219 * fVar200;
                                  auVar102._12_4_ = fVar226 * fVar12;
                                  auVar137._0_4_ = fVar229 * fVar46;
                                  auVar137._4_4_ = fVar234 * fVar2;
                                  auVar137._8_4_ = fVar236 * fVar3;
                                  auVar137._12_4_ = fVar240 * fVar11;
                                  auVar157._0_4_ = fVar229 * fVar259;
                                  auVar157._4_4_ = fVar234 * fVar92;
                                  auVar157._8_4_ = fVar236 * fVar113;
                                  auVar157._12_4_ = fVar240 * fVar114;
                                  auVar64 = vsubps_avx(auVar102,auVar137);
                                  auVar143 = vsubps_avx(auVar157,auVar62);
                                  auVar56 = vandps_avx(auVar209,auVar137);
                                  auVar158 = vandps_avx(auVar209,auVar62);
                                  auVar56 = vcmpps_avx(auVar56,auVar158,1);
                                  auVar158 = vblendvps_avx(auVar143,auVar64,auVar56);
                                  local_1c48._0_4_ = auVar20._0_4_;
                                  local_1c48._4_4_ = auVar20._4_4_;
                                  fStack_1c40 = auVar20._8_4_;
                                  fVar46 = fVar211 * auVar160._0_4_ +
                                           auVar158._0_4_ * fVar68 +
                                           auVar141._0_4_ * (float)local_1c48._0_4_;
                                  fVar67 = fVar213 * auVar160._4_4_ +
                                           auVar158._4_4_ * fVar187 +
                                           auVar141._4_4_ * (float)local_1c48._4_4_;
                                  fVar68 = fVar223 * auVar160._8_4_ +
                                           auVar158._8_4_ * fVar198 + auVar141._8_4_ * fStack_1c40;
                                  fVar172 = fStack_1b0c * auVar160._12_4_ +
                                            auVar158._12_4_ * fVar201 + auVar141._12_4_ * fVar222;
                                  auVar63._0_4_ = fVar46 + fVar46;
                                  auVar63._4_4_ = fVar67 + fVar67;
                                  auVar63._8_4_ = fVar68 + fVar68;
                                  auVar63._12_4_ = fVar172 + fVar172;
                                  fVar46 = auVar160._0_4_ * fVar9 +
                                           auVar158._0_4_ * fVar247 + auVar141._0_4_ * fVar227;
                                  fVar67 = auVar160._4_4_ * fVar10 +
                                           auVar158._4_4_ * fVar254 + auVar141._4_4_ * fVar230;
                                  fVar68 = auVar160._8_4_ * fVar69 +
                                           auVar158._8_4_ * fVar257 + auVar141._8_4_ * fVar235;
                                  fVar172 = auVar160._12_4_ * fVar91 +
                                            auVar158._12_4_ * fVar260 + auVar141._12_4_ * fVar237;
                                  auVar56 = vrcpps_avx(auVar63);
                                  fVar9 = auVar56._0_4_;
                                  auVar182._0_4_ = auVar63._0_4_ * fVar9;
                                  fVar10 = auVar56._4_4_;
                                  auVar182._4_4_ = auVar63._4_4_ * fVar10;
                                  fVar69 = auVar56._8_4_;
                                  auVar182._8_4_ = auVar63._8_4_ * fVar69;
                                  fVar91 = auVar56._12_4_;
                                  auVar182._12_4_ = auVar63._12_4_ * fVar91;
                                  auVar197._8_4_ = 0x3f800000;
                                  auVar197._0_8_ = &DAT_3f8000003f800000;
                                  auVar197._12_4_ = 0x3f800000;
                                  auVar56 = vsubps_avx(auVar197,auVar182);
                                  auVar103._0_4_ =
                                       (fVar46 + fVar46) * (fVar9 + fVar9 * auVar56._0_4_);
                                  auVar103._4_4_ =
                                       (fVar67 + fVar67) * (fVar10 + fVar10 * auVar56._4_4_);
                                  auVar103._8_4_ =
                                       (fVar68 + fVar68) * (fVar69 + fVar69 * auVar56._8_4_);
                                  auVar103._12_4_ =
                                       (fVar172 + fVar172) * (fVar91 + fVar91 * auVar56._12_4_);
                                  auVar56 = vcmpps_avx(auVar103,*(undefined1 (*) [16])(ray + 0x80),2
                                                      );
                                  auVar183 = ZEXT1664(auVar56);
                                  auVar64 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar103,2
                                                      );
                                  auVar56 = vandps_avx(auVar64,auVar56);
                                  auVar64 = vcmpps_avx(auVar63,_DAT_01feba10,4);
                                  auVar56 = vandps_avx(auVar64,auVar56);
                                  auVar56 = vpslld_avx(auVar56,0x1f);
                                  auVar64 = vpsrad_avx(auVar56,0x1f);
                                  auVar56 = auVar65 & auVar64;
                                  auVar65 = vandps_avx(auVar65,auVar64);
                                  if ((((auVar56 >> 0x1f & (undefined1  [16])0x1) !=
                                        (undefined1  [16])0x0 ||
                                       (auVar56 >> 0x3f & (undefined1  [16])0x1) !=
                                       (undefined1  [16])0x0) ||
                                      (auVar56 >> 0x5f & (undefined1  [16])0x1) !=
                                      (undefined1  [16])0x0) || auVar56[0xf] < '\0') {
                                    uStack_17d0 = local_1b68._8_8_;
                                    local_1838 = auVar158;
                                    local_1828 = auVar141;
                                    local_1818 = auVar160;
                                    local_1808 = auVar103;
                                    local_17f8 = auVar233;
                                    _local_17e8 = auVar181;
                                    local_17d8 = local_1b68._0_8_;
                                  }
                                }
                                pGVar4 = (context->scene->geometries).items
                                         [(pre.super_Precalculations.grid)->_geomID].ptr;
                                uVar22 = pGVar4->mask;
                                auVar85._4_4_ = uVar22;
                                auVar85._0_4_ = uVar22;
                                auVar85._8_4_ = uVar22;
                                auVar85._12_4_ = uVar22;
                                auVar56 = vandps_avx(auVar85,*(undefined1 (*) [16])(ray + 0x90));
                                auVar56 = vpcmpeqd_avx(auVar56,_DAT_01feba10);
                                auVar158 = auVar65 & ~auVar56;
                                if ((((auVar158 >> 0x1f & (undefined1  [16])0x1) !=
                                      (undefined1  [16])0x0 ||
                                     (auVar158 >> 0x3f & (undefined1  [16])0x1) !=
                                     (undefined1  [16])0x0) ||
                                    (auVar158 >> 0x5f & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) || auVar158[0xf] < '\0') {
                                  auVar65 = vandnps_avx(auVar56,auVar65);
                                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                     (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                                    auVar88._8_4_ = 0x7fffffff;
                                    auVar88._0_8_ = 0x7fffffff7fffffff;
                                    auVar88._12_4_ = 0x7fffffff;
                                    auVar56 = vandps_avx(local_17f8,auVar88);
                                    auVar158 = vrcpps_avx(local_17f8);
                                    fVar9 = auVar158._0_4_;
                                    auVar126._0_4_ = local_17f8._0_4_ * fVar9;
                                    fVar10 = auVar158._4_4_;
                                    auVar126._4_4_ = local_17f8._4_4_ * fVar10;
                                    fVar69 = auVar158._8_4_;
                                    auVar126._8_4_ = local_17f8._8_4_ * fVar69;
                                    fVar91 = auVar158._12_4_;
                                    auVar126._12_4_ = local_17f8._12_4_ * fVar91;
                                    auVar168._8_4_ = 0x3f800000;
                                    auVar168._0_8_ = &DAT_3f8000003f800000;
                                    auVar168._12_4_ = 0x3f800000;
                                    auVar158 = vsubps_avx(auVar168,auVar126);
                                    auVar107._0_4_ = fVar9 + fVar9 * auVar158._0_4_;
                                    auVar107._4_4_ = fVar10 + fVar10 * auVar158._4_4_;
                                    auVar107._8_4_ = fVar69 + fVar69 * auVar158._8_4_;
                                    auVar107._12_4_ = fVar91 + fVar91 * auVar158._12_4_;
                                    auVar127._8_4_ = 0x219392ef;
                                    auVar127._0_8_ = 0x219392ef219392ef;
                                    auVar127._12_4_ = 0x219392ef;
                                    auVar56 = vcmpps_avx(auVar56,auVar127,5);
                                    auVar56 = vandps_avx(auVar56,auVar107);
                                    auVar89._0_4_ = auVar56._0_4_ * (float)local_17d8;
                                    auVar89._4_4_ = auVar56._4_4_ * local_17d8._4_4_;
                                    auVar89._8_4_ = auVar56._8_4_ * (float)uStack_17d0;
                                    auVar89._12_4_ = auVar56._12_4_ * uStack_17d0._4_4_;
                                    auVar206 = vminps_avx(auVar89,auVar168);
                                    auVar108._0_4_ = auVar56._0_4_ * (float)local_17e8._0_4_;
                                    auVar108._4_4_ = auVar56._4_4_ * (float)local_17e8._4_4_;
                                    auVar108._8_4_ = auVar56._8_4_ * fStack_17e0;
                                    auVar108._12_4_ = auVar56._12_4_ * fStack_17dc;
                                    auVar57 = vminps_avx(auVar108,auVar168);
                                    uVar26 = *(undefined4 *)(pcVar38 + lVar43 + 0x2c);
                                    auVar128._4_4_ = uVar26;
                                    auVar128._0_4_ = uVar26;
                                    auVar128._8_4_ = uVar26;
                                    auVar128._12_4_ = uVar26;
                                    uVar26 = *(undefined4 *)(pcVar38 + lVar43 + 0x30);
                                    auVar140._4_4_ = uVar26;
                                    auVar140._0_4_ = uVar26;
                                    auVar140._8_4_ = uVar26;
                                    auVar140._12_4_ = uVar26;
                                    auVar158 = vpsrld_avx(auVar128,0x10);
                                    auVar47 = ZEXT816(0) << 0x40;
                                    auVar183 = ZEXT1664(auVar47);
                                    auVar56 = vpblendw_avx(auVar128,auVar47,0xaa);
                                    auVar56 = vcvtdq2ps_avx(auVar56);
                                    auVar158 = vcvtdq2ps_avx(auVar158);
                                    auVar160 = vsubps_avx(auVar168,auVar206);
                                    auVar94 = vsubps_avx(auVar160,auVar57);
                                    auVar160 = vpblendw_avx(auVar140,auVar47,0xaa);
                                    auVar160 = vcvtdq2ps_avx(auVar160);
                                    auVar141 = vpsrld_avx(auVar140,0x10);
                                    auVar141 = vcvtdq2ps_avx(auVar141);
                                    uVar26 = *(undefined4 *)(pcVar35 + lVar43);
                                    auVar142._4_4_ = uVar26;
                                    auVar142._0_4_ = uVar26;
                                    auVar142._8_4_ = uVar26;
                                    auVar142._12_4_ = uVar26;
                                    auVar64 = vpblendw_avx(auVar142,auVar47,0xaa);
                                    auVar64 = vcvtdq2ps_avx(auVar64);
                                    auVar143 = vpsrld_avx(auVar142,0x10);
                                    auVar143 = vcvtdq2ps_avx(auVar143);
                                    local_1a08 = local_1818._0_8_;
                                    uStack_1a00 = local_1818._8_8_;
                                    local_19f8 = local_1828._0_8_;
                                    uStack_19f0 = local_1828._8_8_;
                                    local_19e8 = local_1838._0_8_;
                                    uStack_19e0 = local_1838._8_8_;
                                    local_19d8 = auVar206._0_4_ * auVar64._0_4_ * 0.00012207031 +
                                                 auVar94._0_4_ * auVar56._0_4_ * 0.00012207031 +
                                                 auVar57._0_4_ * auVar160._0_4_ * 0.00012207031;
                                    fStack_19d4 = auVar206._4_4_ * auVar64._4_4_ * 0.00012207031 +
                                                  auVar94._4_4_ * auVar56._4_4_ * 0.00012207031 +
                                                  auVar57._4_4_ * auVar160._4_4_ * 0.00012207031;
                                    fStack_19d0 = auVar206._8_4_ * auVar64._8_4_ * 0.00012207031 +
                                                  auVar94._8_4_ * auVar56._8_4_ * 0.00012207031 +
                                                  auVar57._8_4_ * auVar160._8_4_ * 0.00012207031;
                                    fStack_19cc = auVar206._12_4_ * auVar64._12_4_ * 0.00012207031 +
                                                  auVar94._12_4_ * auVar56._12_4_ * 0.00012207031 +
                                                  auVar57._12_4_ * auVar160._12_4_ * 0.00012207031;
                                    local_19a8 = vpshufd_avx(ZEXT416((pre.super_Precalculations.grid
                                                                     )->_geomID),0);
                                    local_19c8 = auVar206._0_4_ * auVar143._0_4_ * 0.00012207031 +
                                                 auVar94._0_4_ * auVar158._0_4_ * 0.00012207031 +
                                                 auVar57._0_4_ * auVar141._0_4_ * 0.00012207031;
                                    fStack_19c4 = auVar206._4_4_ * auVar143._4_4_ * 0.00012207031 +
                                                  auVar94._4_4_ * auVar158._4_4_ * 0.00012207031 +
                                                  auVar57._4_4_ * auVar141._4_4_ * 0.00012207031;
                                    fStack_19c0 = auVar206._8_4_ * auVar143._8_4_ * 0.00012207031 +
                                                  auVar94._8_4_ * auVar158._8_4_ * 0.00012207031 +
                                                  auVar57._8_4_ * auVar141._8_4_ * 0.00012207031;
                                    fStack_19bc = auVar206._12_4_ * auVar143._12_4_ * 0.00012207031
                                                  + auVar94._12_4_ * auVar158._12_4_ * 0.00012207031
                                                    + auVar57._12_4_ *
                                                      auVar141._12_4_ * 0.00012207031;
                                    local_19b8 = vpshufd_avx(ZEXT416((pre.super_Precalculations.grid
                                                                     )->_primID),0);
                                    vcmpps_avx(ZEXT1632(local_19b8),ZEXT1632(local_19b8),0xf);
                                    uStack_1994 = context->user->instID[0];
                                    local_1998 = uStack_1994;
                                    uStack_1990 = uStack_1994;
                                    uStack_198c = uStack_1994;
                                    uStack_1988 = context->user->instPrimID[0];
                                    uStack_1984 = uStack_1988;
                                    uStack_1980 = uStack_1988;
                                    uStack_197c = uStack_1988;
                                    auVar56 = *(undefined1 (*) [16])(ray + 0x80);
                                    auVar158 = vblendvps_avx(auVar56,local_1808,auVar65);
                                    *(undefined1 (*) [16])(ray + 0x80) = auVar158;
                                    args.valid = (int *)local_1bc8;
                                    args.geometryUserPtr = pGVar4->userPtr;
                                    args.context = context->user;
                                    args.hit = (RTCHitN *)&local_1a08;
                                    args.N = 4;
                                    local_1bc8 = auVar65;
                                    args.ray = (RTCRayN *)ray;
                                    if (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                                      auVar183 = ZEXT1664(auVar47);
                                      (*pGVar4->occlusionFilterN)(&args);
                                    }
                                    if (local_1bc8 == (undefined1  [16])0x0) {
                                      auVar65 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                                      auVar65 = auVar65 ^ _DAT_01febe20;
                                    }
                                    else {
                                      p_Var5 = context->args->filter;
                                      if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                                         (((context->args->flags &
                                           RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                          (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                                        auVar183 = ZEXT1664(auVar183._0_16_);
                                        (*p_Var5)(&args);
                                      }
                                      auVar158 = vpcmpeqd_avx((undefined1  [16])0x0,local_1bc8);
                                      auVar65 = auVar158 ^ _DAT_01febe20;
                                      auVar109._8_4_ = 0xff800000;
                                      auVar109._0_8_ = 0xff800000ff800000;
                                      auVar109._12_4_ = 0xff800000;
                                      auVar158 = vblendvps_avx(auVar109,*(undefined1 (*) [16])
                                                                         (args.ray + 0x80),auVar158)
                                      ;
                                      *(undefined1 (*) [16])(args.ray + 0x80) = auVar158;
                                    }
                                    auVar158 = vpslld_avx(auVar65,0x1f);
                                    auVar65 = vpsrad_avx(auVar158,0x1f);
                                    auVar56 = vblendvps_avx(auVar56,*(undefined1 (*) [16])local_1bb0
                                                            ,auVar158);
                                    *(undefined1 (*) [16])local_1bb0 = auVar56;
                                  }
                                  auVar144 = vpandn_avx(auVar65,auVar144);
                                }
                                bVar45 = (((auVar144 >> 0x1f & (undefined1  [16])0x1) !=
                                           (undefined1  [16])0x0 ||
                                          (auVar144 >> 0x3f & (undefined1  [16])0x1) !=
                                          (undefined1  [16])0x0) ||
                                         (auVar144 >> 0x5f & (undefined1  [16])0x1) !=
                                         (undefined1  [16])0x0) || auVar144[0xf] < '\0';
                              }
                              auVar252 = ZEXT1664(auVar144);
                              lVar43 = lVar43 + 4;
                            } while (bVar45);
                            if (local_1b6c == 2) break;
                            pcVar38 = pcVar38 + lVar6;
                            local_1b78 = local_1b78 + lVar6;
                            local_1b80 = local_1b80 + lVar6;
                            local_1b88 = local_1b88 + lVar6;
                            local_1b98 = local_1b98 + lVar6;
                            local_1ba0 = local_1ba0 + lVar6;
                            local_1b90 = local_1b90 + lVar6;
                            pcVar35 = pcVar35 + lVar6;
                            pcVar33 = pcVar33 + lVar6;
                            local_1ba8 = local_1ba8 + lVar6;
                            local_1ac0 = local_1ac0 + lVar6;
                            local_1ac8 = local_1ac8 + lVar6;
                            local_1ad0 = local_1ad0 + lVar6;
                            pcVar40 = pcVar40 + lVar6;
                            bVar45 = local_1ad8 == 0;
                            local_1ad8 = local_1ad8 + 1;
                          } while (bVar45);
                          local_1858 = auVar71._0_4_;
                          uStack_1854 = auVar71._4_4_;
                          uStack_1850 = auVar71._8_4_;
                          uStack_184c = auVar71._12_4_;
                          auVar110._0_4_ = auVar129._0_4_ ^ local_1858;
                          auVar110._4_4_ = auVar129._4_4_ ^ uStack_1854;
                          auVar110._8_4_ = auVar129._8_4_ ^ uStack_1850;
                          auVar110._12_4_ = auVar129._12_4_ ^ uStack_184c;
                          auVar129 = vpor_avx(auVar252._0_16_,auVar130);
                          auVar95 = vpand_avx(auVar129,auVar95);
                          uVar22 = vmovmskps_avx(auVar110);
                          auVar129 = auVar110;
                        } while (uVar22 != 0);
                        aVar13 = (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
                                 (auVar95 ^ _DAT_01febe20);
                      }
                      sVar27 = 0;
                    }
                    else {
                      pre.super_Precalculations.grid = *(GridSOA **)(root.ptr & 0xfffffffffffffff0);
                      sVar27 = ((pre.super_Precalculations.grid)->troot).ptr;
                      aVar13 = (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)auVar7;
                    }
                    terminated.field_0 =
                         (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
                         vpor_avx((undefined1  [16])aVar13,(undefined1  [16])terminated.field_0);
                    auVar112 = _DAT_01febe20 & ~(undefined1  [16])terminated.field_0;
                    if ((((auVar112 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                         (auVar112 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar112 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        -1 < auVar112[0xf]) goto LAB_00332763;
                    auVar111._8_4_ = 0xff800000;
                    auVar111._0_8_ = 0xff800000ff800000;
                    auVar111._12_4_ = 0xff800000;
                    tray.tfar.field_0 =
                         (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                         vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar111,
                                       (undefined1  [16])terminated.field_0);
                    iVar23 = 0;
                    if (sVar27 != 0) {
                      pNVar41->ptr = sVar27;
                      pNVar41 = pNVar41 + 1;
                      aVar66.i[2] = 0xff800000;
                      aVar66._0_8_ = 0xff800000ff800000;
                      aVar66.i[3] = 0xff800000;
                      *paVar44 = aVar66;
                      paVar44 = paVar44 + 1;
                    }
                    break;
                  }
                  goto LAB_00332774;
                }
                uVar24 = root.ptr & 0xfffffffffffffff0;
                auVar112 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,auVar252._0_16_,6);
                auVar252 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
                uVar31 = 0;
                root.ptr = 8;
                do {
                  sVar27 = *(size_t *)(uVar24 + uVar31 * 8);
                  if (sVar27 != 8) {
                    fVar9 = *(float *)(uVar24 + 0x80 + uVar31 * 4);
                    fVar10 = *(float *)(uVar24 + 0x20 + uVar31 * 4);
                    auVar72 = *(undefined1 (*) [16])(ray + 0x70);
                    fVar69 = auVar72._0_4_;
                    fVar91 = auVar72._4_4_;
                    fVar46 = auVar72._8_4_;
                    fVar67 = auVar72._12_4_;
                    auVar93._0_4_ = fVar69 * fVar9 + fVar10;
                    auVar93._4_4_ = fVar91 * fVar9 + fVar10;
                    auVar93._8_4_ = fVar46 * fVar9 + fVar10;
                    auVar93._12_4_ = fVar67 * fVar9 + fVar10;
                    fVar9 = *(float *)(uVar24 + 0xa0 + uVar31 * 4);
                    fVar10 = *(float *)(uVar24 + 0x40 + uVar31 * 4);
                    auVar116._0_4_ = fVar69 * fVar9 + fVar10;
                    auVar116._4_4_ = fVar91 * fVar9 + fVar10;
                    auVar116._8_4_ = fVar46 * fVar9 + fVar10;
                    auVar116._12_4_ = fVar67 * fVar9 + fVar10;
                    fVar9 = *(float *)(uVar24 + 0xc0 + uVar31 * 4);
                    fVar10 = *(float *)(uVar24 + 0x60 + uVar31 * 4);
                    auVar131._0_4_ = fVar69 * fVar9 + fVar10;
                    auVar131._4_4_ = fVar91 * fVar9 + fVar10;
                    auVar131._8_4_ = fVar46 * fVar9 + fVar10;
                    auVar131._12_4_ = fVar67 * fVar9 + fVar10;
                    fVar9 = *(float *)(uVar24 + 0x90 + uVar31 * 4);
                    fVar10 = *(float *)(uVar24 + 0x30 + uVar31 * 4);
                    auVar145._0_4_ = fVar69 * fVar9 + fVar10;
                    auVar145._4_4_ = fVar91 * fVar9 + fVar10;
                    auVar145._8_4_ = fVar46 * fVar9 + fVar10;
                    auVar145._12_4_ = fVar67 * fVar9 + fVar10;
                    fVar9 = *(float *)(uVar24 + 0xb0 + uVar31 * 4);
                    fVar10 = *(float *)(uVar24 + 0x50 + uVar31 * 4);
                    auVar161._0_4_ = fVar69 * fVar9 + fVar10;
                    auVar161._4_4_ = fVar91 * fVar9 + fVar10;
                    auVar161._8_4_ = fVar46 * fVar9 + fVar10;
                    auVar161._12_4_ = fVar67 * fVar9 + fVar10;
                    fVar9 = *(float *)(uVar24 + 0xd0 + uVar31 * 4);
                    fVar10 = *(float *)(uVar24 + 0x70 + uVar31 * 4);
                    auVar173._0_4_ = fVar10 + fVar69 * fVar9;
                    auVar173._4_4_ = fVar10 + fVar91 * fVar9;
                    auVar173._8_4_ = fVar10 + fVar46 * fVar9;
                    auVar173._12_4_ = fVar10 + fVar67 * fVar9;
                    auVar183 = ZEXT1664(auVar173);
                    auVar16._8_8_ = tray.org.field_0._8_8_;
                    auVar16._0_8_ = tray.org.field_0._0_8_;
                    auVar17._8_8_ = tray.org.field_0._24_8_;
                    auVar17._0_8_ = tray.org.field_0._16_8_;
                    auVar18._8_8_ = tray.org.field_0._40_8_;
                    auVar18._0_8_ = tray.org.field_0._32_8_;
                    auVar129 = vsubps_avx(auVar93,auVar16);
                    auVar231._0_4_ = tray.rdir.field_0._0_4_ * auVar129._0_4_;
                    auVar231._4_4_ = tray.rdir.field_0._4_4_ * auVar129._4_4_;
                    auVar231._8_4_ = tray.rdir.field_0._8_4_ * auVar129._8_4_;
                    auVar231._12_4_ = tray.rdir.field_0._12_4_ * auVar129._12_4_;
                    auVar129 = vsubps_avx(auVar116,auVar17);
                    auVar238._0_4_ = auVar129._0_4_ * (float)tray.rdir.field_0._16_4_;
                    auVar238._4_4_ = auVar129._4_4_ * (float)tray.rdir.field_0._20_4_;
                    auVar238._8_4_ = auVar129._8_4_ * (float)tray.rdir.field_0._24_4_;
                    auVar238._12_4_ = auVar129._12_4_ * (float)tray.rdir.field_0._28_4_;
                    auVar129 = vsubps_avx(auVar131,auVar18);
                    auVar243._0_4_ = auVar129._0_4_ * (float)tray.rdir.field_0._32_4_;
                    auVar243._4_4_ = auVar129._4_4_ * (float)tray.rdir.field_0._36_4_;
                    auVar243._8_4_ = auVar129._8_4_ * (float)tray.rdir.field_0._40_4_;
                    auVar243._12_4_ = auVar129._12_4_ * (float)tray.rdir.field_0._44_4_;
                    auVar129 = vsubps_avx(auVar145,auVar16);
                    auVar146._0_4_ = tray.rdir.field_0._0_4_ * auVar129._0_4_;
                    auVar146._4_4_ = tray.rdir.field_0._4_4_ * auVar129._4_4_;
                    auVar146._8_4_ = tray.rdir.field_0._8_4_ * auVar129._8_4_;
                    auVar146._12_4_ = tray.rdir.field_0._12_4_ * auVar129._12_4_;
                    auVar129 = vsubps_avx(auVar161,auVar17);
                    auVar117._0_4_ = auVar129._0_4_ * (float)tray.rdir.field_0._16_4_;
                    auVar117._4_4_ = auVar129._4_4_ * (float)tray.rdir.field_0._20_4_;
                    auVar117._8_4_ = auVar129._8_4_ * (float)tray.rdir.field_0._24_4_;
                    auVar117._12_4_ = auVar129._12_4_ * (float)tray.rdir.field_0._28_4_;
                    auVar129 = vsubps_avx(auVar173,auVar18);
                    auVar132._0_4_ = auVar129._0_4_ * (float)tray.rdir.field_0._32_4_;
                    auVar132._4_4_ = auVar129._4_4_ * (float)tray.rdir.field_0._36_4_;
                    auVar132._8_4_ = auVar129._8_4_ * (float)tray.rdir.field_0._40_4_;
                    auVar132._12_4_ = auVar129._12_4_ * (float)tray.rdir.field_0._44_4_;
                    auVar129 = vpminsd_avx(auVar231,auVar146);
                    auVar71 = vpminsd_avx(auVar238,auVar117);
                    auVar129 = vpmaxsd_avx(auVar129,auVar71);
                    auVar71 = vpminsd_avx(auVar243,auVar132);
                    auVar129 = vpmaxsd_avx(auVar129,auVar71);
                    auVar71 = vpmaxsd_avx(auVar231,auVar146);
                    auVar130 = vpmaxsd_avx(auVar238,auVar117);
                    auVar65 = vpminsd_avx(auVar71,auVar130);
                    auVar71 = vpmaxsd_avx(auVar243,auVar132);
                    auVar130 = vpmaxsd_avx(auVar129,(undefined1  [16])tray.tnear.field_0);
                    auVar71 = vpminsd_avx(auVar65,auVar71);
                    auVar71 = vpminsd_avx(auVar71,(undefined1  [16])tray.tfar.field_0);
                    if ((uVar22 & 7) == 6) {
                      auVar71 = vcmpps_avx(auVar130,auVar71,2);
                      uVar26 = *(undefined4 *)(uVar24 + 0xe0 + uVar31 * 4);
                      auVar133._4_4_ = uVar26;
                      auVar133._0_4_ = uVar26;
                      auVar133._8_4_ = uVar26;
                      auVar133._12_4_ = uVar26;
                      auVar130 = vcmpps_avx(auVar133,auVar72,2);
                      uVar26 = *(undefined4 *)(uVar24 + 0xf0 + uVar31 * 4);
                      auVar147._4_4_ = uVar26;
                      auVar147._0_4_ = uVar26;
                      auVar147._8_4_ = uVar26;
                      auVar147._12_4_ = uVar26;
                      auVar72 = vcmpps_avx(auVar72,auVar147,1);
                      auVar72 = vandps_avx(auVar130,auVar72);
                      auVar72 = vandps_avx(auVar72,auVar71);
                    }
                    else {
                      auVar72 = vcmpps_avx(auVar130,auVar71,2);
                    }
                    auVar72 = vandps_avx(auVar72,auVar112);
                    auVar72 = vpslld_avx(auVar72,0x1f);
                    if ((((auVar72 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                         (auVar72 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar72 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        auVar72[0xf] < '\0') {
                      auVar118._8_4_ = 0x7f800000;
                      auVar118._0_8_ = 0x7f8000007f800000;
                      auVar118._12_4_ = 0x7f800000;
                      auVar72 = vblendvps_avx(auVar118,auVar129,auVar72);
                      if (root.ptr != 8) {
                        pNVar41->ptr = root.ptr;
                        pNVar41 = pNVar41 + 1;
                        *paVar44 = auVar252._0_16_;
                        paVar44 = paVar44 + 1;
                      }
                      auVar252 = ZEXT1664(auVar72);
                      root.ptr = sVar27;
                    }
                  }
                } while ((sVar27 != 8) && (bVar45 = uVar31 < 3, uVar31 = uVar31 + 1, bVar45));
                iVar23 = 0;
                if (root.ptr == 8) {
LAB_003310ef:
                  bVar45 = false;
                  iVar23 = 4;
                }
                else {
                  auVar112 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,
                                        (undefined1  [16])auVar252._0_16_,6);
                  uVar26 = vmovmskps_avx(auVar112);
                  bVar45 = true;
                  if ((uint)POPCOUNT(uVar26) <= uVar36) {
                    pNVar41->ptr = root.ptr;
                    pNVar41 = pNVar41 + 1;
                    *paVar44 = auVar252._0_16_;
                    paVar44 = paVar44 + 1;
                    goto LAB_003310ef;
                  }
                }
              } while (bVar45);
            }
          }
        }
      } while (iVar23 != 3);
      auVar7 = vandps_avx(auVar90,(undefined1  [16])terminated.field_0);
      auVar90._8_4_ = 0xff800000;
      auVar90._0_8_ = 0xff800000ff800000;
      auVar90._12_4_ = 0xff800000;
      auVar7 = vmaskmovps_avx(auVar7,auVar90);
      *(undefined1 (*) [16])local_1bb0 = auVar7;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }